

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O3

void __thiscall Spaghetti<RemSP>::FirstScan(Spaghetti<RemSP> *this)

{
  long lVar1;
  char cVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  uint *puVar5;
  uint uVar6;
  long lVar7;
  undefined4 uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  ulong uVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  ulong local_d0;
  ulong local_b0;
  int local_a8;
  long local_90;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar19 = *(uint *)&pMVar3->field_0x8;
  uVar28 = *(uint *)&pMVar3->field_0xc;
  *(uint *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 = uVar19 & 0xfffffffe;
  this->o_rows = (uVar19 & 0x80000001) == 1;
  this->e_cols = uVar28 & 0xfffffffe;
  this->o_cols = (uVar28 & 0x80000001) == 1;
  puVar5 = RemSP::P_;
  *RemSP::P_ = 0;
  RemSP::length_ = 1;
  lVar18 = *(long *)&pMVar3->field_0x10;
  if (uVar19 == 1) {
    lVar29 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    uVar17 = uVar28 - 2;
    uVar19 = 0;
    if (2 < (int)uVar28) {
      uVar28 = 0xfffffffe;
      uVar20 = 0;
LAB_0016da79:
      uVar19 = (uint)uVar20;
      if (*(char *)(lVar18 + (int)uVar19) == '\0') goto LAB_0016daa9;
      cVar2 = *(char *)(lVar18 + 3 + (long)(int)uVar28);
      puVar5[RemSP::length_] = RemSP::length_;
      uVar28 = RemSP::length_ + 1;
      *(uint *)(lVar29 + (long)(int)uVar19 * 4) = RemSP::length_;
      RemSP::length_ = uVar28;
      uVar28 = uVar19;
      if (cVar2 == '\0') goto LAB_0016db28;
      while( true ) {
        uVar28 = (int)uVar20 + 2;
        if ((int)uVar17 <= (int)uVar28) break;
        uVar25 = (long)(int)uVar20;
        while (*(char *)(lVar18 + 2 + uVar25) != '\0') {
          if (*(char *)(lVar18 + 3 + uVar25) == '\0') {
            uVar8 = *(undefined4 *)(lVar29 + uVar25 * 4);
            lVar23 = uVar25 + 2;
            goto LAB_0016db24;
          }
          *(undefined4 *)(lVar29 + 8 + uVar25 * 4) = *(undefined4 *)(lVar29 + uVar25 * 4);
          uVar20 = uVar25 + 2;
          uVar28 = uVar28 + 2;
          lVar23 = uVar25 + 4;
          uVar25 = uVar20;
          if ((long)(ulong)uVar17 <= lVar23) goto LAB_0016ddc6;
        }
        uVar20 = (ulong)uVar28;
LAB_0016daa9:
        uVar28 = (uint)uVar20;
        lVar23 = (long)(int)uVar28;
        if (*(char *)(lVar18 + 1 + lVar23) == '\0') goto LAB_0016db0f;
        puVar5[RemSP::length_] = RemSP::length_;
        uVar19 = RemSP::length_ + 1;
        *(uint *)(lVar29 + lVar23 * 4) = RemSP::length_;
        RemSP::length_ = uVar19;
      }
LAB_0016ddc6:
      lVar23 = (long)(int)uVar28;
      if ((int)uVar17 < (int)uVar28) {
        if (*(char *)(lVar18 + lVar23) == '\0') goto LAB_0016de9f;
      }
      else if (*(char *)(lVar18 + lVar23) == '\0') goto LAB_0016de7d;
      *(undefined4 *)(lVar29 + lVar23 * 4) = *(undefined4 *)(lVar29 + (long)(int)uVar20 * 4);
      return;
    }
LAB_0016db37:
    lVar23 = (long)(int)uVar19;
    cVar2 = *(char *)(lVar18 + lVar23);
    if ((int)uVar19 <= (int)uVar17) {
      if (cVar2 != '\0') goto LAB_0016de85;
LAB_0016de7d:
      cVar2 = *(char *)(lVar18 + 1 + lVar23);
    }
    if (cVar2 == '\0') {
LAB_0016de9f:
      *(undefined4 *)(lVar29 + lVar23 * 4) = 0;
      return;
    }
LAB_0016de85:
    puVar5[RemSP::length_] = RemSP::length_;
    uVar19 = RemSP::length_ + 1;
    *(uint *)(lVar29 + lVar23 * 4) = RemSP::length_;
    RemSP::length_ = uVar19;
    return;
  }
  lVar23 = **(long **)&pMVar3->field_0x48;
  lVar29 = lVar18 + lVar23;
  lVar11 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  uVar20 = (long)(int)uVar28 - 2;
  uVar25 = 0;
  local_a8 = (int)uVar20;
  if (2 < (int)uVar28) {
    uVar25 = 0;
    do {
      lVar39 = (long)(int)uVar25;
      if (*(char *)(lVar18 + lVar39) != '\0') goto LAB_0016dd49;
      if (*(char *)(lVar29 + lVar39) != '\0') goto LAB_0016dd49;
LAB_0016dbd0:
      iVar22 = (int)uVar25;
      uVar14 = (ulong)iVar22;
      if ((*(char *)(uVar14 + 1 + lVar18) != '\0') || (*(char *)(lVar29 + 1 + uVar14) != '\0')) {
        uVar40 = (ulong)RemSP::length_;
        puVar5[uVar40] = RemSP::length_;
        RemSP::length_ = RemSP::length_ + 1;
LAB_0016dbf7:
        *(int *)(lVar11 + uVar14 * 4) = (int)uVar40;
LAB_0016dc1c:
        lVar39 = (long)(int)uVar25;
        uVar25 = lVar39 + 2;
        if ((int)uVar25 < local_a8) {
          if ((*(char *)(lVar18 + uVar25) != '\0') || (*(char *)(lVar29 + uVar25) != '\0')) {
LAB_0016dc3c:
            lVar39 = (long)(int)uVar25;
            cVar2 = *(char *)(lVar18 + 1 + lVar39);
            *(undefined4 *)(lVar11 + lVar39 * 4) = *(undefined4 *)(lVar11 + -8 + lVar39 * 4);
            if (cVar2 == '\0') {
              do {
                iVar22 = (int)uVar25;
                uVar17 = iVar22 + 2;
                if (local_a8 <= (int)uVar17) {
LAB_0016ddee:
                  uVar25 = (ulong)(int)uVar17;
                  if (local_a8 < (int)uVar17) {
                    if ((*(char *)(lVar18 + uVar25) == '\0') && (*(char *)(lVar29 + uVar25) == '\0')
                       ) {
                      *(undefined4 *)(lVar11 + uVar25 * 4) = 0;
                      goto LAB_0016df59;
                    }
                  }
                  else {
                    if (*(char *)(lVar18 + uVar25) != '\0') {
                      uVar14 = uVar25;
                      if (*(char *)(lVar29 + 1 + (long)iVar22) == '\0') goto LAB_0016de63;
                      goto LAB_0016df50;
                    }
                    if (*(char *)(lVar29 + uVar25) == '\0') {
                      uVar25 = (ulong)uVar17;
                      goto LAB_0016df17;
                    }
                  }
                  if (*(char *)(lVar29 + 1 + (long)iVar22) == '\0') {
                    puVar5[RemSP::length_] = RemSP::length_;
                    uVar6 = RemSP::length_ + 1;
                    *(uint *)(lVar11 + (long)(int)uVar17 * 4) = RemSP::length_;
                    RemSP::length_ = uVar6;
                  }
                  else {
                    *(undefined4 *)(lVar11 + (long)(int)uVar17 * 4) =
                         *(undefined4 *)(lVar11 + (long)iVar22 * 4);
                  }
                  goto LAB_0016df59;
                }
                lVar41 = (long)iVar22;
                lVar1 = lVar41 + 2;
                lVar39 = lVar11 + lVar41 * 4;
                lVar10 = lVar18 + lVar23 + 2 + lVar41;
                lVar33 = lVar18 + 2 + lVar41;
                lVar41 = lVar41 << 0x20;
                lVar43 = 0;
                while (*(char *)(lVar33 + lVar43) == '\0') {
                  if (*(char *)(lVar10 + lVar43) == '\0') {
                    uVar25 = (ulong)(uint)((int)lVar1 + (int)lVar43);
                    goto LAB_0016dbd0;
                  }
                  if (*(char *)(lVar33 + 1 + lVar43) != '\0') {
                    uVar14 = lVar1 + lVar43;
                    if (*(char *)(lVar43 + -1 + lVar10) == '\0') {
                      uVar40 = (ulong)RemSP::length_;
                      puVar5[uVar40] = RemSP::length_;
                      RemSP::length_ = RemSP::length_ + 1;
                    }
                    else {
                      uVar40 = (ulong)*(uint *)(lVar39 + lVar43 * 4);
                    }
                    uVar25 = uVar14 & 0xffffffff;
                    goto LAB_0016dbf7;
                  }
                  if (*(char *)(lVar10 + -1 + lVar43) == '\0') {
                    puVar5[RemSP::length_] = RemSP::length_;
                    uVar17 = RemSP::length_;
                    RemSP::length_ = RemSP::length_ + 1;
                  }
                  else {
                    uVar17 = *(uint *)(lVar39 + lVar43 * 4);
                  }
                  *(uint *)(lVar39 + 8 + lVar43 * 4) = uVar17;
                  lVar41 = lVar41 + 0x200000000;
                  lVar7 = lVar1 + lVar43;
                  lVar43 = lVar43 + 2;
                  if ((long)(uVar20 & 0xffffffff) <= lVar7 + 2) {
                    uVar17 = iVar22 + (int)lVar43 + 2;
                    iVar22 = iVar22 + (int)lVar43;
                    goto LAB_0016ddee;
                  }
                }
                if (*(char *)(lVar29 + 1 + (lVar41 >> 0x20)) != '\0') goto code_r0x0016dd09;
                lVar39 = lVar41 + 0x200000000 >> 0x20;
                uVar25 = lVar1 + lVar43 & 0xffffffff;
LAB_0016dd49:
                cVar2 = *(char *)(lVar18 + 1 + lVar39);
                puVar5[RemSP::length_] = RemSP::length_;
                uVar17 = RemSP::length_ + 1;
                *(uint *)(lVar11 + lVar39 * 4) = RemSP::length_;
                RemSP::length_ = uVar17;
                if (cVar2 != '\0') break;
              } while( true );
            }
            goto LAB_0016dc1c;
          }
          goto LAB_0016dbd0;
        }
        if (local_a8 < (int)uVar25) {
          if ((*(char *)(lVar18 + uVar25) == '\0') && (*(char *)(lVar29 + uVar25) == '\0')) {
            *(undefined4 *)(lVar11 + 8 + lVar39 * 4) = 0;
          }
          else {
            *(undefined4 *)(lVar11 + 8 + lVar39 * 4) = *(undefined4 *)(lVar11 + lVar39 * 4);
          }
        }
        else {
          if ((*(char *)(lVar18 + uVar25) == '\0') && (*(char *)(lVar29 + uVar25) == '\0'))
          goto LAB_0016df17;
LAB_0016df50:
          *(undefined4 *)(lVar11 + uVar25 * 4) = *(undefined4 *)(lVar11 + -8 + uVar25 * 4);
        }
        goto LAB_0016df59;
      }
      *(undefined4 *)(lVar11 + (long)iVar22 * 4) = 0;
      uVar25 = (ulong)(iVar22 + 2U);
    } while ((int)(iVar22 + 2U) < local_a8);
  }
  uVar14 = (ulong)(int)uVar25;
  if (local_a8 < (int)uVar25) {
    if ((*(char *)(lVar18 + uVar14) == '\0') && (*(char *)(lVar29 + uVar14) == '\0')) {
      *(undefined4 *)(lVar11 + uVar14 * 4) = 0;
    }
    else {
LAB_0016de63:
      puVar5[RemSP::length_] = RemSP::length_;
      uVar17 = RemSP::length_ + 1;
      *(uint *)(lVar11 + uVar14 * 4) = RemSP::length_;
      RemSP::length_ = uVar17;
    }
  }
  else {
    if ((*(char *)(lVar18 + uVar14) != '\0') || (*(char *)(lVar29 + uVar14) != '\0'))
    goto LAB_0016de63;
LAB_0016df17:
    lVar23 = (long)(int)uVar25;
    if ((*(char *)(lVar23 + 1 + lVar18) == '\0') && (*(char *)(lVar29 + 1 + lVar23) == '\0')) {
      *(undefined4 *)(lVar11 + lVar23 * 4) = 0;
    }
    else {
      puVar5[RemSP::length_] = RemSP::length_;
      uVar17 = RemSP::length_ + 1;
      *(uint *)(lVar11 + lVar23 * 4) = RemSP::length_;
      RemSP::length_ = uVar17;
    }
  }
LAB_0016df59:
  if (*(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 < 3) {
    if ((uVar19 & 0x80000001) != 1) {
      return;
    }
  }
  else {
    lVar29 = 2;
    lVar23 = 1;
    lVar18 = 3;
    local_90 = 0;
    do {
      pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar10 = *(long *)&pMVar3->field_0x10;
      lVar33 = **(long **)&pMVar3->field_0x48;
      lVar16 = lVar33 * lVar29;
      lVar11 = lVar10 + lVar16;
      lVar44 = lVar11 - lVar33;
      lVar39 = lVar11 + lVar33;
      lVar41 = *(long *)&pMVar4->field_0x10;
      lVar43 = **(long **)&pMVar4->field_0x48;
      lVar7 = lVar43 * lVar29;
      lVar1 = lVar41 + lVar7;
      lVar24 = lVar1 + lVar43 * -2;
      cVar2 = *(char *)(lVar10 + lVar16);
      if (2 < (int)uVar28) {
        lVar27 = lVar44 - lVar33;
        local_d0 = 0;
        uVar25 = 0;
        if (cVar2 == '\0') goto LAB_0016e0c9;
LAB_0016e03a:
        local_d0 = uVar25;
        lVar31 = (long)(int)local_d0;
        if (*(char *)(lVar31 + 1 + lVar44) == '\0') {
          if (*(char *)(lVar11 + 1 + lVar31) != '\0') goto LAB_0016e16f;
          if (*(char *)(lVar44 + lVar31) != '\0') {
            *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + lVar31 * 4);
            goto LAB_0016f24c;
          }
          RemSP::P_[RemSP::length_] = RemSP::length_;
          uVar17 = RemSP::length_ + 1;
          *(uint *)(lVar1 + lVar31 * 4) = RemSP::length_;
          RemSP::length_ = uVar17;
          goto LAB_0016e55b;
        }
        *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + lVar31 * 4);
LAB_00170be8:
        iVar22 = (int)local_d0;
        uVar17 = iVar22 + 2;
        if ((int)uVar17 < local_a8) {
          lVar35 = (long)iVar22;
          lVar31 = lVar35 + 2;
          lVar26 = lVar33 * lVar18 + lVar35;
          lVar21 = lVar33 * lVar23 + lVar35;
          lVar45 = lVar43 * local_90 + lVar35 * 4;
          lVar34 = lVar7 + lVar35 * 4;
          lVar36 = lVar35 << 0x20;
          lVar42 = lVar10 + lVar16 + lVar35;
          lVar12 = lVar10 + 2 + lVar21;
          lVar30 = lVar41 + lVar45 + 8;
          lVar9 = lVar41 + lVar34 + 8;
          lVar15 = 0;
          do {
            lVar37 = lVar36 >> 0x1e;
            lVar32 = lVar36 >> 0x20;
            if (*(char *)(lVar42 + 2 + lVar15) == '\0') {
              local_d0 = lVar31 + lVar15;
              if (*(char *)(lVar15 + 2 + lVar26 + lVar10) == '\0') goto LAB_0016e0ef;
              lVar31 = lVar36 + 0x300000000 >> 0x20;
              lVar42 = lVar36 + 0x100000000 >> 0x20;
              if (*(char *)(lVar11 + lVar31) == '\0') {
                if (*(char *)(lVar39 + lVar42) != '\0') {
                  *(undefined4 *)(lVar34 + lVar41 + 8 + lVar15 * 4) =
                       *(undefined4 *)(lVar1 + lVar37);
                  goto LAB_0016ebb8;
                }
                if (*(char *)(lVar11 + lVar42) == '\0') {
                  RemSP::P_[RemSP::length_] = RemSP::length_;
                  uVar17 = RemSP::length_ + 1;
                  *(uint *)(lVar34 + lVar41 + 8 + lVar15 * 4) = RemSP::length_;
                  RemSP::length_ = uVar17;
                  goto LAB_0016ebb8;
                }
                *(undefined4 *)(lVar34 + lVar41 + 8 + lVar15 * 4) = *(undefined4 *)(lVar1 + lVar37);
                goto LAB_0016ebb8;
              }
              if (*(char *)(lVar11 + lVar42) != '\0') {
                uVar25 = lVar36 + 0x200000000 >> 0x20;
                goto LAB_00170f40;
              }
              if (*(char *)(lVar39 + lVar42) == '\0') {
                uVar25 = local_d0 & 0xffffffff;
                goto LAB_0016e103;
              }
              if (*(char *)(lVar44 + lVar31) != '\0') goto LAB_00170f58;
              if (*(char *)(lVar44 + 4 + lVar32) != '\0') {
                uVar25 = lVar36 + 0x200000000 >> 0x20;
                goto LAB_00170206;
              }
              if (*(char *)(lVar15 + 2 + lVar21 + lVar10) != '\0') {
                *(undefined4 *)(lVar9 + lVar15 * 4) =
                     *(undefined4 *)(lVar45 + lVar41 + 8 + lVar15 * 4);
                goto LAB_0016e7b7;
              }
              *(undefined4 *)(lVar9 + lVar15 * 4) = *(undefined4 *)(lVar1 + lVar32 * 4);
              goto LAB_0016f372;
            }
            iVar13 = (int)lVar31;
            if ((*(char *)(lVar42 + 1 + lVar15) != '\0') ||
               (*(char *)(lVar10 + lVar26 + 1 + lVar15) != '\0')) {
              local_d0 = (ulong)(uint)(iVar13 + (int)lVar15);
              goto LAB_001701a5;
            }
            if (*(char *)(lVar12 + 1 + lVar15) == '\0') {
              local_d0 = lVar31 + lVar15;
              if (*(char *)(lVar15 + 3 + lVar16 + lVar35 + lVar10) == '\0') {
                if (*(char *)(lVar15 + 2 + lVar21 + lVar10) != '\0') {
                  *(undefined4 *)(lVar9 + lVar15 * 4) = *(undefined4 *)(lVar30 + lVar15 * 4);
                  local_d0 = local_d0 & 0xffffffff;
                  goto LAB_0016f24c;
                }
                *(undefined4 *)(lVar34 + lVar41 + 8 + lVar15 * 4) = *(undefined4 *)(lVar24 + lVar37)
                ;
                local_d0 = local_d0 & 0xffffffff;
                goto LAB_0016e55b;
              }
              cVar2 = *(char *)(lVar15 + 2 + lVar21 + lVar10);
              if (*(char *)(lVar44 + 4 + lVar32) == '\0') {
                if (cVar2 != '\0') {
                  *(undefined4 *)(lVar9 + lVar15 * 4) =
                       *(undefined4 *)(lVar45 + lVar41 + 8 + lVar15 * 4);
                  goto LAB_0016e7b7;
                }
                *(undefined4 *)(lVar9 + lVar15 * 4) = *(undefined4 *)(lVar24 + lVar32 * 4);
                goto LAB_0016f372;
              }
              if (cVar2 == '\0') {
                lVar31 = lVar36 + 0x200000000 >> 0x20;
                goto LAB_0017138a;
              }
LAB_0016e3ec:
              lVar31 = (long)(int)local_d0;
              if (*(char *)(lVar27 + 1 + lVar31) == '\0') {
                uVar17 = RemSP::Merge(*(uint *)(lVar24 + lVar31 * 4),
                                      *(uint *)(lVar24 + 8 + lVar31 * 4));
              }
              else {
                uVar17 = *(uint *)(lVar24 + 8 + lVar31 * 4);
              }
              *(uint *)(lVar1 + lVar31 * 4) = uVar17;
LAB_0016f5f7:
              iVar22 = (int)local_d0;
              uVar17 = iVar22 + 2;
              if ((int)uVar17 < local_a8) {
                lVar9 = (long)iVar22;
                lVar26 = lVar9 << 0x20;
                lVar42 = lVar16 + lVar9 + lVar10;
                lVar12 = lVar42 + 3;
                lVar15 = lVar33 * lVar23 + lVar9 + lVar10;
                lVar31 = lVar41 + lVar43 * local_90 + lVar9 * 4;
                lVar30 = lVar31 + 8;
                lVar45 = lVar7 + lVar9 * 4;
                lVar34 = lVar41 + 8 + lVar45;
                lVar21 = 0;
                while( true ) {
                  lVar35 = lVar26 >> 0x1e;
                  iVar13 = (int)(lVar9 + 2);
                  iVar38 = (int)lVar21;
                  if (*(char *)(lVar42 + 2 + lVar21) == '\0') {
                    if (*(char *)(lVar33 * lVar18 + lVar9 + lVar10 + 2 + lVar21) == '\0') {
                      local_d0 = lVar9 + 2 + lVar21;
                      lVar31 = lVar26 + 0x300000000 >> 0x20;
                      if (*(char *)(lVar11 + lVar31) == '\0') {
                        local_d0 = local_d0 & 0xffffffff;
                        goto LAB_0016e23d;
                      }
                      if (*(char *)(lVar44 + lVar31) != '\0') {
                        *(undefined4 *)(lVar34 + lVar21 * 4) = *(undefined4 *)(lVar30 + lVar21 * 4);
                        goto LAB_0016e117;
                      }
                      if (*(char *)(lVar44 + 4 + (lVar26 >> 0x20)) == '\0') {
                        *(undefined4 *)(lVar34 + lVar21 * 4) = *(undefined4 *)(lVar30 + lVar21 * 4);
                        local_d0 = local_d0 & 0xffffffff;
                        goto LAB_0016e7b7;
                      }
                      local_d0 = local_d0 & 0xffffffff;
                      goto LAB_0016e3ec;
                    }
                    if (*(char *)(lVar12 + lVar21) == '\0') {
                      local_d0 = (ulong)(uint)(iVar13 + iVar38);
                      *(undefined4 *)(lVar45 + lVar41 + 8 + lVar21 * 4) =
                           *(undefined4 *)(lVar1 + lVar35);
                      goto LAB_0016ebb8;
                    }
                    if (*(char *)(lVar15 + 3 + lVar21) != '\0') {
                      local_d0 = (ulong)(uint)(iVar13 + iVar38);
                      *(undefined4 *)(lVar34 + lVar21 * 4) = *(undefined4 *)(lVar30 + lVar21 * 4);
                      goto LAB_0016e117;
                    }
                  }
                  else {
                    if (*(char *)(lVar15 + 3 + lVar21) != '\0') {
                      local_d0 = (ulong)(uint)(iVar13 + iVar38);
                      *(undefined4 *)(lVar34 + lVar21 * 4) = *(undefined4 *)(lVar30 + lVar21 * 4);
                      goto LAB_00170be8;
                    }
                    if (*(char *)(lVar12 + lVar21) == '\0') {
                      *(undefined4 *)(lVar45 + lVar41 + 8 + lVar21 * 4) =
                           *(undefined4 *)(lVar1 + lVar35);
                      local_d0 = (ulong)(uint)(iVar13 + iVar38);
                      goto LAB_00170279;
                    }
                  }
                  if (*(char *)(lVar15 + 4 + lVar21) == '\0') break;
                  uVar17 = *(uint *)(lVar31 + 0x10 + lVar21 * 4);
                  if (*(char *)(lVar33 * local_90 + lVar9 + lVar10 + 3 + lVar21) == '\0') {
                    uVar17 = RemSP::Merge(uVar17,*(uint *)(lVar34 + -8 + lVar21 * 4));
                  }
                  *(uint *)(lVar34 + lVar21 * 4) = uVar17;
                  lVar26 = lVar26 + 0x200000000;
                  lVar35 = lVar9 + lVar21;
                  lVar21 = lVar21 + 2;
                  if ((long)uVar20 <= lVar35 + 4) {
                    iVar22 = iVar22 + (int)lVar21;
                    uVar17 = iVar13 + (int)lVar21;
                    goto LAB_0016f838;
                  }
                }
                *(undefined4 *)(lVar45 + lVar41 + 8 + lVar21 * 4) = *(undefined4 *)(lVar1 + lVar35);
                local_d0 = (ulong)(uint)(iVar13 + iVar38);
LAB_0016fa27:
                iVar22 = (int)local_d0;
                uVar17 = iVar22 + 2;
                if ((int)uVar17 < local_a8) {
                  lVar34 = (long)iVar22;
                  lVar31 = lVar34 + 2;
                  lVar26 = lVar34 << 0x20;
                  lVar45 = lVar7 + lVar34 * 4;
                  lVar21 = lVar41 + lVar45 + 8;
                  lVar42 = lVar16 + lVar34 + lVar10;
                  lVar12 = lVar42 + 3;
                  lVar9 = lVar33 * lVar23 + lVar34 + lVar10;
                  lVar15 = 0;
LAB_0016faa9:
                  iVar38 = (int)lVar31;
                  lVar35 = lVar26 >> 0x1e;
                  iVar13 = (int)lVar15;
                  lVar30 = lVar26 >> 0x20;
                  if (*(char *)(lVar42 + 2 + lVar15) == '\0') {
                    if (*(char *)(lVar33 * lVar18 + lVar34 + lVar10 + 2 + lVar15) == '\0') {
                      local_d0 = (ulong)(uint)(iVar38 + iVar13);
                      goto LAB_0016f4af;
                    }
                    if (*(char *)(lVar12 + lVar15) == '\0') {
                      *(undefined4 *)(lVar45 + lVar41 + 8 + lVar15 * 4) =
                           *(undefined4 *)(lVar1 + lVar35);
                      local_d0 = (ulong)(uint)(iVar38 + iVar13);
                      goto LAB_0016ebb8;
                    }
                    if (*(char *)(lVar9 + 3 + lVar15) != '\0') {
                      local_d0 = lVar31 + lVar15;
                      if (*(char *)(lVar15 + 2 + lVar33 * local_90 + lVar34 + lVar10) == '\0') {
                        uVar17 = *(uint *)(lVar43 * local_90 + lVar34 * 4 + lVar41 + 8 + lVar15 * 4)
                        ;
                        uVar6 = *(uint *)(lVar1 + lVar35);
                      }
                      else {
                        if (*(char *)(lVar44 + lVar30) != '\0') {
                          uVar25 = lVar26 + 0x200000000 >> 0x20;
                          goto LAB_0016fe6a;
                        }
                        uVar17 = *(uint *)(lVar43 * local_90 + lVar34 * 4 + lVar41 + 8 + lVar15 * 4)
                        ;
                        uVar6 = *(uint *)(lVar1 + lVar30 * 4);
                      }
                      uVar17 = RemSP::Merge(uVar17,uVar6);
                      *(uint *)(lVar21 + lVar15 * 4) = uVar17;
                      goto LAB_0016e117;
                    }
                  }
                  else {
                    if (*(char *)(lVar9 + 3 + lVar15) != '\0') {
                      local_d0 = lVar31 + lVar15;
                      if (*(char *)(lVar15 + 2 + lVar33 * local_90 + lVar34 + lVar10) == '\0') {
                        uVar17 = *(uint *)(lVar43 * local_90 + lVar34 * 4 + lVar41 + 8 + lVar15 * 4)
                        ;
                        uVar6 = *(uint *)(lVar1 + lVar35);
                      }
                      else {
                        if (*(char *)(lVar44 + lVar30) != '\0') {
                          uVar25 = lVar26 + 0x200000000 >> 0x20;
LAB_0016e800:
                          uVar17 = *(uint *)(lVar24 + uVar25 * 4);
                          if (*(char *)(lVar27 + -1 + uVar25) == '\0') {
                            uVar17 = RemSP::Merge(uVar17,*(uint *)(lVar1 + -8 + uVar25 * 4));
                            *(uint *)(lVar1 + uVar25 * 4) = uVar17;
                          }
                          else {
                            *(uint *)(lVar1 + uVar25 * 4) = uVar17;
                          }
                          goto LAB_00170be8;
                        }
                        uVar17 = *(uint *)(lVar43 * local_90 + lVar34 * 4 + lVar41 + 8 + lVar15 * 4)
                        ;
                        uVar6 = *(uint *)(lVar1 + lVar30 * 4);
                      }
                      uVar17 = RemSP::Merge(uVar17,uVar6);
                      *(uint *)(lVar21 + lVar15 * 4) = uVar17;
                      goto LAB_00170be8;
                    }
                    if (*(char *)(lVar12 + lVar15) == '\0') goto LAB_0016fd4e;
                  }
                  if (*(char *)(lVar9 + 4 + lVar15) == '\0') {
                    *(undefined4 *)(lVar21 + lVar15 * 4) =
                         *(undefined4 *)(lVar41 + lVar45 + lVar15 * 4);
                    lVar26 = lVar26 + 0x200000000;
                    lVar30 = lVar31 + lVar15;
                    lVar15 = lVar15 + 2;
                    if ((long)uVar20 <= lVar30 + 2) {
                      iVar22 = iVar22 + (int)lVar15;
                      uVar17 = iVar38 + (int)lVar15;
                      goto LAB_0016fb50;
                    }
                    goto LAB_0016faa9;
                  }
                  local_d0 = lVar31 + lVar15;
                  if (*(char *)(lVar27 + 3 + lVar30) == '\0') {
                    uVar17 = RemSP::Merge(*(uint *)(lVar43 * local_90 + lVar34 * 4 + lVar41 + 0x10 +
                                                   lVar15 * 4),*(uint *)(lVar1 + lVar30 * 4));
                    *(uint *)(lVar21 + lVar15 * 4) = uVar17;
                  }
                  else {
                    if (*(char *)(lVar15 + 2 + lVar33 * local_90 + lVar34 + lVar10) == '\0') {
                      uVar17 = RemSP::Merge(*(uint *)(lVar43 * local_90 + lVar34 * 4 + lVar41 + 0x10
                                                     + lVar15 * 4),*(uint *)(lVar1 + lVar30 * 4));
                    }
                    else {
                      if (*(char *)(lVar44 + lVar30) != '\0') {
                        uVar25 = lVar26 + 0x200000000 >> 0x20;
LAB_0016fc8e:
                        local_d0 = local_d0 & 0xffffffff;
                        uVar17 = *(uint *)(lVar24 + 8 + uVar25 * 4);
                        if (*(char *)(lVar27 + -1 + uVar25) == '\0') {
                          uVar17 = RemSP::Merge(uVar17,*(uint *)(lVar1 + -8 + uVar25 * 4));
                          *(uint *)(lVar1 + uVar25 * 4) = uVar17;
                        }
                        else {
                          *(uint *)(lVar1 + uVar25 * 4) = uVar17;
                        }
                        goto LAB_0016f5f7;
                      }
                      uVar17 = RemSP::Merge(*(uint *)(lVar43 * local_90 + lVar34 * 4 + lVar41 + 0x10
                                                     + lVar15 * 4),*(uint *)(lVar1 + lVar30 * 4));
                    }
                    *(uint *)(lVar21 + lVar15 * 4) = uVar17;
                  }
                  local_d0 = local_d0 & 0xffffffff;
                  goto LAB_0016f5f7;
                }
LAB_0016fb50:
                local_d0 = (ulong)uVar17;
                uVar25 = local_d0;
                if (local_a8 < (int)uVar17) goto LAB_0016fb5c;
                if (*(char *)(lVar11 + local_d0) == '\0') {
                  if (*(char *)(lVar39 + local_d0) == '\0') {
LAB_0016fbed:
                    uVar17 = (uint)local_d0;
                    uVar25 = (ulong)(int)uVar17;
                    if (*(char *)(uVar25 + 1 + lVar11) == '\0') goto LAB_001710d7;
                    cVar2 = *(char *)(lVar44 + 1 + uVar25);
                    goto joined_r0x0016fc04;
                  }
                  if (*(char *)(lVar11 + 3 + (long)iVar22) == '\0') {
                    uVar17 = *(uint *)(lVar1 + (long)iVar22 * 4);
                    goto LAB_00170dc5;
                  }
                }
                lVar11 = (long)iVar22;
                if (*(char *)(lVar44 + 3 + lVar11) == '\0') {
                  uVar17 = *(uint *)(lVar1 + lVar11 * 4);
                }
                else {
                  if (*(char *)(lVar27 + local_d0) != '\0') {
LAB_001705ac:
                    lVar11 = (long)(int)local_d0;
                    if (*(char *)(lVar11 + -2 + lVar44) == '\0') {
LAB_001705d1:
                      uVar17 = *(uint *)(lVar24 + lVar11 * 4);
                    }
                    else {
LAB_001705b7:
                      lVar11 = (long)(int)local_d0;
                      uVar17 = *(uint *)(lVar24 + lVar11 * 4);
                      if (*(char *)(lVar27 + -1 + lVar11) != '\0') {
                        *(uint *)(lVar1 + lVar11 * 4) = uVar17;
                        goto LAB_00171134;
                      }
                    }
                    uVar17 = RemSP::Merge(uVar17,*(uint *)(lVar1 + -8 + lVar11 * 4));
                    *(uint *)(lVar1 + lVar11 * 4) = uVar17;
                    goto LAB_00171134;
                  }
                  uVar17 = *(uint *)(lVar24 + local_d0 * 4);
                  uVar6 = *(uint *)(lVar1 + lVar11 * 4);
LAB_0016fbb7:
                  uVar17 = RemSP::Merge(uVar17,uVar6);
                  local_d0 = uVar25;
                }
                *(uint *)(lVar1 + local_d0 * 4) = uVar17;
                goto LAB_00171134;
              }
LAB_0016f838:
              uVar25 = (ulong)uVar17;
              if (local_a8 < (int)uVar17) {
LAB_0016fb5c:
                uVar25 = (ulong)(int)uVar25;
                if (*(char *)(lVar11 + uVar25) == '\0') {
LAB_0016fb65:
                  if (*(char *)(lVar39 + uVar25) == '\0') goto LAB_00171104;
                }
                uVar8 = *(undefined4 *)(lVar1 + -8 + uVar25 * 4);
                goto LAB_00170e97;
              }
              if (*(char *)(lVar11 + uVar25) == '\0') {
                lVar10 = (long)iVar22;
                cVar2 = *(char *)(lVar11 + 3 + lVar10);
                if (*(char *)(lVar39 + uVar25) == '\0') {
                  if (cVar2 != '\0') goto LAB_0016e075;
                  goto LAB_001710d7;
                }
                if (cVar2 == '\0') goto LAB_00170e92;
              }
              lVar10 = (long)iVar22;
              if (*(char *)(lVar44 + 3 + lVar10) != '\0') goto LAB_0016e075;
              goto LAB_00170e92;
            }
            if (*(char *)(lVar12 + lVar15) == '\0') goto LAB_00170ff9;
            *(undefined4 *)(lVar9 + lVar15 * 4) = *(undefined4 *)(lVar30 + lVar15 * 4);
            lVar36 = lVar36 + 0x200000000;
            lVar32 = lVar31 + lVar15;
            lVar15 = lVar15 + 2;
            if ((long)uVar20 <= lVar32 + 2) {
              iVar22 = iVar22 + (int)lVar15;
              uVar17 = iVar13 + (int)lVar15;
              break;
            }
          } while( true );
        }
        uVar25 = (ulong)uVar17;
        if (local_a8 < (int)uVar17) {
          if (*(char *)(lVar11 + uVar25) == '\0') {
            if (*(char *)(lVar39 + uVar25) == '\0') goto LAB_00171104;
LAB_00170e7a:
            if ((*(char *)(lVar39 + (ulong)(iVar22 + 1)) != '\0') ||
               (*(char *)(lVar11 + (ulong)(iVar22 + 1)) != '\0')) goto LAB_00170e8f;
            goto LAB_001710e2;
          }
          if ((*(char *)(lVar11 + (ulong)(iVar22 + 1)) == '\0') &&
             (*(char *)(lVar39 + (ulong)(iVar22 + 1)) == '\0')) {
LAB_00171159:
            if (*(char *)(lVar44 + uVar25) == '\0') {
              uVar8 = *(undefined4 *)(lVar24 + (long)iVar22 * 4);
              goto LAB_00170e97;
            }
            goto LAB_0016e075;
          }
LAB_00170e8f:
          lVar10 = (long)iVar22;
LAB_00170e92:
          uVar8 = *(undefined4 *)(lVar1 + lVar10 * 4);
          goto LAB_00170e97;
        }
        if (*(char *)(lVar11 + uVar25) == '\0') {
          local_d0 = uVar25;
          if (*(char *)(lVar39 + uVar25) == '\0') {
LAB_001710c2:
            local_d0 = local_d0 & 0xffffffff;
            goto LAB_001710c4;
          }
          if (*(char *)(lVar11 + (ulong)(iVar22 + 3)) == '\0') goto LAB_00170e7a;
          if (*(char *)(lVar11 + (ulong)(iVar22 + 1)) != '\0') goto LAB_00170e38;
          if (*(char *)(lVar39 + (ulong)(iVar22 + 1)) != '\0') {
            if (*(char *)(lVar44 + (ulong)(iVar22 + 3)) == '\0') {
              if (*(char *)(lVar44 + uVar25) == '\0') goto LAB_00170e8f;
              goto LAB_0016e075;
            }
            lVar11 = (long)(int)uVar17;
            goto LAB_00170e43;
          }
          goto LAB_0016dff9;
        }
        if ((*(char *)(lVar11 + (ulong)(iVar22 + 1)) == '\0') &&
           (*(char *)(lVar39 + (ulong)(iVar22 + 1)) == '\0')) {
          if (*(char *)(lVar44 + 3 + (long)iVar22) == '\0') goto LAB_00171159;
          if (*(char *)(lVar44 + uVar25) != '\0') goto LAB_0016e075;
          uVar25 = (ulong)(int)uVar17;
LAB_00170db1:
          if (*(char *)(lVar27 + uVar25) == '\0') {
            uVar17 = *(uint *)(lVar24 + -8 + uVar25 * 4);
            uVar6 = *(uint *)(lVar24 + uVar25 * 4);
LAB_0016edfe:
            uVar17 = RemSP::Merge(uVar17,uVar6);
          }
          else {
LAB_00170dc1:
            uVar17 = *(uint *)(lVar24 + uVar25 * 4);
          }
LAB_00170dc5:
          *(uint *)(lVar1 + uVar25 * 4) = uVar17;
        }
        else {
LAB_00170e38:
          lVar11 = (long)(int)uVar17;
          if (*(char *)(lVar44 + 1 + lVar11) == '\0') {
            uVar17 = *(uint *)(lVar1 + -8 + lVar11 * 4);
          }
          else {
LAB_00170e43:
            if (*(char *)(lVar44 + lVar11) == '\0') {
              uVar17 = *(uint *)(lVar24 + lVar11 * 4);
              if (*(char *)(lVar27 + lVar11) != '\0') {
                *(uint *)(lVar1 + lVar11 * 4) = uVar17;
                goto LAB_00171134;
              }
              uVar17 = RemSP::Merge(uVar17,*(uint *)(lVar1 + -8 + lVar11 * 4));
            }
            else {
              uVar17 = *(uint *)(lVar24 + lVar11 * 4);
            }
          }
          *(uint *)(lVar1 + lVar11 * 4) = uVar17;
        }
        goto LAB_00171134;
      }
      if (uVar28 == 2) {
        local_d0 = 0;
        uVar17 = 0;
        if (cVar2 == '\0') {
LAB_0016e31c:
          uVar17 = (uint)local_d0;
          uVar25 = (ulong)(int)uVar17;
          if (*(char *)(lVar39 + uVar25) == '\0') {
            local_d0 = local_d0 & 0xffffffff;
LAB_001710c4:
            uVar17 = (uint)local_d0;
            if (*(char *)(lVar11 + 1 + (long)(int)uVar17) != '\0') goto LAB_0016dff9;
LAB_001710d7:
            uVar25 = (ulong)(int)uVar17;
            if (*(char *)(lVar39 + 1 + uVar25) == '\0') goto LAB_00171104;
          }
          else if (*(char *)(lVar11 + 1 + uVar25) != '\0') goto LAB_0016dff9;
LAB_001710e2:
          RemSP::P_[RemSP::length_] = RemSP::length_;
          uVar17 = RemSP::length_ + 1;
          *(uint *)(lVar1 + uVar25 * 4) = RemSP::length_;
          RemSP::length_ = uVar17;
        }
        else {
LAB_0016dff9:
          uVar25 = (ulong)(int)uVar17;
          if (*(char *)(lVar44 + 1 + uVar25) == '\0') goto LAB_0016e067;
LAB_0016e075:
          uVar8 = *(undefined4 *)(lVar24 + uVar25 * 4);
LAB_00170e97:
          *(undefined4 *)(lVar1 + uVar25 * 4) = uVar8;
        }
      }
      else {
        uVar17 = 0;
        local_d0 = 0;
        if (cVar2 != '\0') {
LAB_0016e067:
          uVar25 = (ulong)(int)uVar17;
          cVar2 = *(char *)(lVar44 + uVar25);
joined_r0x0016fc04:
          if (cVar2 == '\0') goto LAB_001710e2;
          goto LAB_0016e075;
        }
LAB_0016e2dd:
        uVar25 = (ulong)(int)local_d0;
        if (*(char *)(lVar39 + uVar25) != '\0') goto LAB_001710e2;
LAB_00171104:
        *(undefined4 *)(lVar1 + uVar25 * 4) = 0;
      }
LAB_00171134:
      lVar29 = lVar29 + 2;
      lVar23 = lVar23 + 2;
      local_90 = local_90 + 2;
      lVar18 = lVar18 + 2;
    } while ((int)lVar29 < *(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74);
    if ((this->o_rows & 1U) == 0) {
      return;
    }
  }
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  lVar23 = *(long *)&pMVar3->field_0x10;
  lVar11 = **(long **)&pMVar3->field_0x48;
  lVar10 = (long)(int)(uVar19 - 1);
  lVar18 = lVar23 + lVar11 * lVar10;
  lVar33 = lVar18 - lVar11;
  lVar39 = *(long *)&pMVar4->field_0x10;
  lVar1 = **(long **)&pMVar4->field_0x48;
  lVar29 = lVar39 + lVar1 * lVar10;
  lVar41 = lVar29 + lVar1 * -2;
  uVar19 = 0;
  if (2 < (int)uVar28) {
    lVar45 = lVar33 - lVar11;
    lVar7 = lVar33 + 1;
    lVar43 = lVar41 + 8;
    uVar20 = uVar20 & 0xffffffff;
    lVar44 = lVar1 * lVar10 + lVar39 + 8;
    lVar27 = (lVar10 + -1) * lVar11;
    lVar31 = lVar27 + lVar23 + 4;
    lVar24 = lVar11 * lVar10 + lVar23 + 3;
    lVar16 = lVar11 * (lVar10 + -2) + lVar23 + 3;
    lVar11 = lVar1 * (lVar10 + -2) + lVar39 + 0x10;
    iVar22 = -2;
    uVar25 = 0;
    do {
      lVar39 = (long)(int)uVar25;
      if (*(char *)(lVar18 + lVar39) == '\0') goto LAB_00171765;
      if (*(char *)((long)iVar22 + 3 + lVar33) != '\0') {
        *(undefined4 *)(lVar29 + lVar39 * 4) = *(undefined4 *)(lVar41 + lVar39 * 4);
        goto LAB_00171f49;
      }
      if (*(char *)(lVar18 + 3 + (long)iVar22) != '\0') {
LAB_0017177f:
        uVar14 = (ulong)(int)uVar25;
        if (*(char *)(lVar33 + 2 + uVar14) != '\0') {
          if (*(char *)(lVar33 + uVar14) != '\0') goto LAB_00171796;
          goto LAB_00171ac2;
        }
        if (*(char *)(lVar33 + uVar14) == '\0') goto LAB_00171acd;
LAB_001717b6:
        *(undefined4 *)(lVar29 + uVar14 * 4) = *(undefined4 *)(lVar41 + uVar14 * 4);
        lVar39 = (long)(int)uVar25;
        uVar14 = lVar39 + 2;
        if ((int)uVar14 < local_a8) {
          uVar25 = uVar14;
          if (*(char *)(lVar18 + uVar14) == '\0') goto LAB_00171a75;
          if (*(char *)(lVar39 + 3 + lVar33) != '\0') {
            if (*(char *)(lVar45 + uVar14) == '\0') {
              uVar19 = RemSP::Merge(*(uint *)(lVar41 + 8 + lVar39 * 4),
                                    *(uint *)(lVar29 + lVar39 * 4));
              *(uint *)(lVar29 + 8 + lVar39 * 4) = uVar19;
              goto LAB_00171f49;
            }
LAB_00171df2:
            if (*(char *)(lVar45 + -1 + uVar14) != '\0') goto LAB_0017209c;
            uVar19 = *(uint *)(lVar41 + -8 + uVar14 * 4);
            uVar28 = *(uint *)(lVar41 + uVar14 * 4);
            goto LAB_001720e8;
          }
          if (*(char *)(lVar18 + 3 + lVar39) != '\0') {
            if (*(char *)(lVar39 + 4 + lVar33) == '\0') goto LAB_00171a4e;
            if ((*(char *)(lVar45 + 3 + lVar39) == '\0') || (*(char *)(lVar45 + uVar14) == '\0')) {
              uVar19 = RemSP::Merge(*(uint *)(lVar41 + 0x10 + lVar39 * 4),
                                    *(uint *)(lVar29 + lVar39 * 4));
              *(uint *)(lVar29 + 8 + lVar39 * 4) = uVar19;
              goto LAB_00171aed;
            }
LAB_00171e8d:
            cVar2 = *(char *)(lVar45 + -1 + uVar14);
            uVar19 = *(uint *)(lVar43 + uVar14 * 4);
joined_r0x00171ea1:
            if (cVar2 != '\0') {
              *(uint *)(lVar29 + uVar14 * 4) = uVar19;
              uVar14 = uVar25;
              goto LAB_00171aed;
            }
LAB_00172130:
            uVar28 = *(uint *)(lVar29 + -8 + uVar14 * 4);
            do {
              uVar19 = RemSP::Merge(uVar19,uVar28);
LAB_00172145:
              *(uint *)(lVar29 + uVar14 * 4) = uVar19;
              uVar14 = uVar25;
LAB_00171aed:
              iVar22 = (int)uVar14;
              uVar19 = iVar22 + 2;
              if (local_a8 <= (int)uVar19) {
LAB_001722ce:
                if (local_a8 < (int)uVar19) {
                  uVar14 = (ulong)uVar19;
                  goto LAB_001722d7;
                }
                uVar14 = (ulong)(int)uVar19;
                lVar23 = (long)iVar22;
                if (*(char *)(lVar18 + uVar14) == '\0') {
                  if (*(char *)(lVar18 + 3 + lVar23) != '\0') goto LAB_001724ec;
                  goto LAB_00172474;
                }
                if (*(char *)(lVar33 + 3 + lVar23) != '\0') goto LAB_001724ec;
LAB_00172307:
                uVar8 = *(undefined4 *)(lVar29 + lVar23 * 4);
                goto LAB_001724f1;
              }
              lVar42 = (long)iVar22;
              lVar12 = lVar42 << 0x20;
              lVar39 = lVar44 + lVar42 * 4;
              lVar1 = lVar31 + lVar42;
              lVar10 = lVar11 + lVar42 * 4;
              lVar34 = 0;
LAB_00171b56:
              if (*(char *)(lVar24 + lVar42 + -1 + lVar34) != '\0') {
                iVar38 = (int)lVar34;
                iVar13 = (int)(lVar42 + 2);
                if (*(char *)(lVar1 + -1 + lVar34) != '\0') {
                  uVar25 = (ulong)(uint)(iVar13 + iVar38);
                  *(undefined4 *)(lVar39 + lVar34 * 4) = *(undefined4 *)(lVar10 + -8 + lVar34 * 4);
                  goto LAB_00171f49;
                }
                if (*(char *)(lVar24 + lVar42 + lVar34) != '\0') goto code_r0x00171b79;
                uVar19 = iVar13 + iVar38;
                *(undefined4 *)(lVar39 + lVar34 * 4) = *(undefined4 *)(lVar29 + (lVar12 >> 0x1e));
LAB_00171e25:
                uVar25 = (ulong)uVar19;
                goto LAB_0017219b;
              }
              uVar25 = lVar42 + 2 + lVar34;
              iVar22 = (int)uVar25;
              lVar39 = lVar12 + 0x300000000 >> 0x20;
              uVar14 = lVar42 + 2 + lVar34;
              if (*(char *)(lVar18 + lVar39) == '\0') goto LAB_0017188f;
              if (*(char *)(lVar33 + lVar39) != '\0') {
LAB_00171a8b:
                do {
                  *(undefined4 *)(lVar29 + uVar14 * 4) = *(undefined4 *)(lVar41 + uVar14 * 4);
                  uVar14 = (long)(int)uVar25 + 2;
                  if (local_a8 <= (int)uVar14) {
                    if (local_a8 < (int)uVar14) goto LAB_001722d7;
                    if (*(char *)(lVar18 + uVar14) == '\0') goto LAB_00172364;
LAB_00172325:
                    if (*(char *)(lVar33 + 1 + uVar14) == '\0') {
                      uVar8 = *(undefined4 *)(lVar29 + -8 + uVar14 * 4);
                      goto LAB_00172380;
                    }
                    if (*(char *)(lVar33 + uVar14) != '\0') goto LAB_0017237b;
                    uVar19 = *(uint *)(lVar41 + uVar14 * 4);
                    if (*(char *)(lVar45 + uVar14) != '\0') {
                      *(uint *)(lVar29 + uVar14 * 4) = uVar19;
                      return;
                    }
                    uVar28 = *(uint *)(lVar29 + -8 + uVar14 * 4);
                    goto LAB_0017257e;
                  }
                  uVar25 = uVar14;
                  if (*(char *)(lVar18 + uVar14) != '\0') goto LAB_00171ffb;
LAB_00171765:
                  iVar22 = (int)uVar25;
                  uVar14 = (ulong)iVar22;
                  if (*(char *)(uVar14 + 1 + lVar18) == '\0') {
                    while( true ) {
                      uVar14 = (ulong)iVar22;
LAB_0017188f:
                      *(undefined4 *)(lVar29 + uVar14 * 4) = 0;
                      lVar39 = (long)iVar22;
                      uVar14 = lVar39 + 2;
                      if (local_a8 <= (int)uVar14) break;
                      uVar25 = uVar14;
                      if (*(char *)(lVar18 + uVar14) == '\0') goto LAB_00171765;
                      if (*(char *)(lVar39 + 3 + lVar33) != '\0') {
                        if ((*(char *)(lVar33 + uVar14) == '\0') &&
                           (*(char *)(lVar7 + lVar39) != '\0')) goto LAB_00172095;
                        *(undefined4 *)(lVar29 + 8 + lVar39 * 4) =
                             *(undefined4 *)(lVar41 + 8 + lVar39 * 4);
                        goto LAB_00171f49;
                      }
                      if (*(char *)(lVar18 + 3 + lVar39) == '\0') {
                        if (*(char *)(lVar33 + uVar14) == '\0') {
                          if (*(char *)(lVar7 + lVar39) == '\0') {
                            RemSP::P_[RemSP::length_] = RemSP::length_;
                            uVar19 = RemSP::length_ + 1;
                            *(uint *)(lVar29 + 8 + lVar39 * 4) = RemSP::length_;
                            RemSP::length_ = uVar19;
                            goto LAB_0017219b;
                          }
                          uVar8 = *(undefined4 *)(lVar41 + lVar39 * 4);
                        }
                        else {
                          uVar8 = *(undefined4 *)(lVar41 + 8 + lVar39 * 4);
                        }
                        *(undefined4 *)(lVar29 + 8 + lVar39 * 4) = uVar8;
                        goto LAB_0017219b;
                      }
                      cVar2 = *(char *)(lVar39 + 2 + lVar33);
                      if (*(char *)(lVar39 + 4 + lVar33) != '\0') {
                        if (cVar2 != '\0') goto LAB_00171796;
                        if (*(char *)(lVar7 + lVar39) == '\0') {
                          *(undefined4 *)(lVar29 + 8 + lVar39 * 4) =
                               *(undefined4 *)(lVar41 + 0x10 + lVar39 * 4);
                        }
                        else {
LAB_00172155:
                          if ((*(char *)(lVar45 + 1 + uVar14) == '\0') ||
                             (*(char *)(lVar45 + uVar14) == '\0')) {
                            uVar19 = RemSP::Merge(*(uint *)(lVar41 + -8 + uVar14 * 4),
                                                  *(uint *)(lVar41 + 8 + uVar14 * 4));
                          }
                          else {
                            uVar19 = *(uint *)(lVar43 + uVar14 * 4);
                          }
                          *(uint *)(lVar29 + uVar14 * 4) = uVar19;
                          uVar14 = uVar25;
                        }
                        goto LAB_00171aed;
                      }
                      if (cVar2 != '\0') goto LAB_001717b6;
                      if (*(char *)(lVar7 + lVar39) == '\0') {
                        RemSP::P_[RemSP::length_] = RemSP::length_;
                        uVar19 = RemSP::length_;
                        RemSP::length_ = RemSP::length_ + 1;
                      }
                      else {
                        uVar19 = *(uint *)(lVar41 + lVar39 * 4);
                      }
LAB_001719b9:
                      *(uint *)(lVar29 + uVar14 * 4) = uVar19;
                      lVar39 = (long)(int)uVar25;
                      uVar14 = lVar39 + 2;
                      if (local_a8 <= (int)uVar14) {
                        if (local_a8 < (int)uVar14) goto LAB_001722d7;
                        uVar20 = uVar14;
                        if (*(char *)(lVar18 + uVar14) == '\0') goto LAB_0017243a;
                        if (*(char *)(lVar33 + 3 + lVar39) != '\0') goto LAB_00172427;
                        goto LAB_0017255c;
                      }
                      uVar25 = uVar14;
                      if (*(char *)(lVar18 + uVar14) != '\0') {
                        if (*(char *)(lVar39 + 3 + lVar33) != '\0') {
                          uVar19 = RemSP::Merge(*(uint *)(lVar41 + 8 + lVar39 * 4),
                                                *(uint *)(lVar29 + lVar39 * 4));
                          *(uint *)(lVar29 + 8 + lVar39 * 4) = uVar19;
                          goto LAB_00171f49;
                        }
                        if (*(char *)(lVar18 + 3 + lVar39) == '\0') {
                          *(undefined4 *)(lVar29 + 8 + lVar39 * 4) =
                               *(undefined4 *)(lVar29 + lVar39 * 4);
                          goto LAB_0017219b;
                        }
                        if (*(char *)(lVar39 + 4 + lVar33) != '\0') {
                          uVar19 = RemSP::Merge(*(uint *)(lVar41 + 0x10 + lVar39 * 4),
                                                *(uint *)(lVar29 + lVar39 * 4));
                          *(uint *)(lVar29 + 8 + lVar39 * 4) = uVar19;
                          goto LAB_00171aed;
                        }
LAB_00171a4e:
                        *(undefined4 *)(lVar29 + 8 + lVar39 * 4) =
                             *(undefined4 *)(lVar29 + lVar39 * 4);
LAB_00171cf3:
                        while( true ) {
                          iVar22 = (int)uVar25;
                          uVar19 = iVar22 + 2;
                          if (local_a8 <= (int)uVar19) break;
                          lVar34 = (long)iVar22;
                          lVar39 = lVar34 + 2;
                          lVar42 = lVar34 << 0x20;
                          lVar1 = lVar44 + lVar34 * 4;
                          lVar10 = lVar31 + lVar34;
                          lVar12 = 0;
                          while( true ) {
                            if (*(char *)(lVar24 + lVar34 + -1 + lVar12) == '\0') {
                              uVar25 = (ulong)(uint)((int)lVar39 + (int)lVar12);
                              goto LAB_00171a75;
                            }
                            lVar9 = lVar42 >> 0x1e;
                            lVar15 = lVar42 >> 0x20;
                            if (*(char *)(lVar10 + -1 + lVar12) != '\0') break;
                            if (*(char *)(lVar24 + lVar34 + lVar12) == '\0') {
                              uVar19 = (int)lVar39 + (int)lVar12;
                              *(undefined4 *)(lVar1 + lVar12 * 4) = *(undefined4 *)(lVar29 + lVar9);
                              goto LAB_00171e25;
                            }
                            if (*(char *)(lVar10 + lVar12) != '\0') {
                              if ((*(char *)(lVar12 + lVar16 + lVar34) == '\0') ||
                                 (*(char *)(lVar12 + -1 + lVar16 + lVar34) == '\0')) {
                                uVar19 = *(uint *)(lVar11 + lVar34 * 4 + lVar12 * 4);
                                uVar28 = *(uint *)(lVar29 + lVar9);
                              }
                              else {
                                if (*(char *)(lVar33 + lVar15) != '\0') {
                                  uVar14 = lVar42 + 0x200000000 >> 0x20;
                                  uVar25 = lVar39 + lVar12 & 0xffffffff;
                                  goto LAB_00171e8d;
                                }
                                uVar19 = *(uint *)(lVar11 + lVar34 * 4 + lVar12 * 4);
                                uVar28 = *(uint *)(lVar29 + lVar15 * 4);
                              }
                              uVar19 = RemSP::Merge(uVar19,uVar28);
                              *(uint *)(lVar1 + lVar12 * 4) = uVar19;
                              uVar14 = lVar39 + lVar12 & 0xffffffff;
                              goto LAB_00171aed;
                            }
                            *(undefined4 *)(lVar1 + lVar12 * 4) =
                                 *(undefined4 *)(lVar1 + -8 + lVar12 * 4);
                            lVar42 = lVar42 + 0x200000000;
                            lVar15 = lVar12 + lVar39;
                            lVar12 = lVar12 + 2;
                            if ((long)uVar20 <= lVar15 + 2) {
                              uVar19 = iVar22 + (int)lVar12 + 2;
                              iVar22 = iVar22 + (int)lVar12;
                              goto LAB_0017220a;
                            }
                          }
                          if (*(char *)(lVar12 + -1 + lVar16 + lVar34) == '\0') {
                            uVar19 = *(uint *)(lVar11 + lVar34 * 4 + -8 + lVar12 * 4);
                            uVar28 = *(uint *)(lVar29 + lVar9);
                          }
                          else {
                            if (*(char *)(lVar33 + lVar15) != '\0') {
                              uVar14 = lVar42 + 0x200000000 >> 0x20;
                              uVar25 = lVar39 + lVar12 & 0xffffffff;
                              goto LAB_00171df2;
                            }
                            uVar19 = *(uint *)(lVar11 + lVar34 * 4 + -8 + lVar12 * 4);
                            uVar28 = *(uint *)(lVar29 + lVar15 * 4);
                          }
                          uVar19 = RemSP::Merge(uVar19,uVar28);
                          *(uint *)(lVar1 + lVar12 * 4) = uVar19;
                          uVar25 = lVar39 + lVar12 & 0xffffffff;
LAB_00171f49:
                          iVar22 = (int)uVar25;
                          iVar13 = iVar22 + 2;
                          if (local_a8 <= iVar13) {
LAB_0017227c:
                            uVar14 = (ulong)iVar13;
                            if (local_a8 < iVar13) {
                              if (*(char *)(lVar18 + uVar14) == '\0') goto LAB_00172474;
                              lVar23 = (long)iVar22;
                              if (*(char *)(lVar18 + 1 + lVar23) != '\0') goto LAB_00172307;
                            }
                            else {
                              if (*(char *)(lVar18 + uVar14) == '\0') goto LAB_00172364;
                              if (*(char *)(lVar18 + 1 + (long)iVar22) != '\0') goto LAB_00172325;
                              if (*(char *)(lVar33 + 3 + (long)iVar22) != '\0') {
                                if (*(char *)(lVar33 + uVar14) != '\0') goto LAB_001724ec;
                                goto LAB_001724cb;
                              }
                            }
                            if (*(char *)(lVar33 + uVar14) != '\0') goto LAB_001724ec;
                            uVar8 = *(undefined4 *)(lVar41 + (long)iVar22 * 4);
                            goto LAB_001724f1;
                          }
                          lVar15 = (long)iVar22;
                          lVar39 = lVar15 + 2;
                          lVar1 = lVar11 + lVar15 * 4;
                          lVar10 = lVar23 + lVar27 + 2 + lVar15;
                          lVar34 = lVar24 + lVar15;
                          lVar42 = lVar44 + lVar15 * 4;
                          lVar15 = lVar15 << 0x20;
                          lVar12 = 0;
LAB_00171f9c:
                          lVar15 = lVar15 + 0x200000000;
                          iVar13 = (int)lVar39;
                          iVar38 = (int)lVar12;
                          if (*(char *)(lVar34 + -1 + lVar12) == '\0') {
                            uVar25 = (ulong)(uint)(iVar13 + iVar38);
                            goto LAB_00171765;
                          }
                          if (*(char *)(lVar34 + -2 + lVar12) == '\0') {
                            if (*(char *)(lVar10 + 1 + lVar12) == '\0') {
                              uVar14 = lVar39 + lVar12;
                              if (*(char *)(lVar12 + lVar34) != '\0') {
                                if (*(char *)(lVar12 + 2 + lVar10) != '\0') {
                                  if (*(char *)(lVar12 + lVar10) == '\0') {
                                    uVar25 = uVar14 & 0xffffffff;
                                    uVar14 = lVar15 >> 0x20;
                                    goto LAB_00172155;
                                  }
                                  uVar25 = uVar14 & 0xffffffff;
                                  goto LAB_00171796;
                                }
                                if (*(char *)(lVar12 + lVar10) != '\0') {
                                  uVar25 = uVar14 & 0xffffffff;
                                  goto LAB_001717b6;
                                }
                                uVar25 = uVar14 & 0xffffffff;
                                uVar19 = *(uint *)(lVar1 + -0x10 + lVar12 * 4);
                                goto LAB_001719b9;
                              }
                              if (*(char *)(lVar12 + lVar10) == '\0') {
                                uVar8 = *(undefined4 *)(lVar1 + -0x10 + lVar12 * 4);
                              }
                              else {
                                uVar8 = *(undefined4 *)(lVar1 + -8 + lVar12 * 4);
                              }
                              *(undefined4 *)(lVar42 + lVar12 * 4) = uVar8;
                              uVar25 = uVar14 & 0xffffffff;
                              goto LAB_0017219b;
                            }
                            if (*(char *)(lVar10 + lVar12) != '\0') goto code_r0x00171fc1;
                            uVar14 = lVar15 >> 0x20;
                            uVar25 = (ulong)(uint)(iVar13 + iVar38);
LAB_00172095:
                            if (*(char *)(lVar45 + uVar14) == '\0') {
                              uVar19 = RemSP::Merge(*(uint *)(lVar41 + -8 + uVar14 * 4),
                                                    *(uint *)(lVar41 + uVar14 * 4));
                            }
                            else {
LAB_0017209c:
                              uVar19 = *(uint *)(lVar41 + uVar14 * 4);
                            }
LAB_00172103:
                            *(uint *)(lVar29 + uVar14 * 4) = uVar19;
                            goto LAB_00171f49;
                          }
                          uVar25 = (ulong)(uint)(iVar13 + iVar38);
LAB_00171ffb:
                          uVar14 = (ulong)(int)uVar25;
                          if (*(char *)(uVar14 + 1 + lVar33) != '\0') {
                            if (*(char *)(lVar33 + uVar14) != '\0') goto LAB_0017209c;
                            uVar19 = *(uint *)(lVar41 + uVar14 * 4);
                            if (*(char *)(lVar45 + uVar14) == '\0') {
                              uVar28 = *(uint *)(lVar29 + -8 + uVar14 * 4);
LAB_001720e8:
                              uVar19 = RemSP::Merge(uVar19,uVar28);
                              goto LAB_00172103;
                            }
                            *(uint *)(lVar29 + uVar14 * 4) = uVar19;
                            goto LAB_00171f49;
                          }
                          if (*(char *)(lVar18 + 1 + uVar14) == '\0') {
                            *(undefined4 *)(lVar29 + uVar14 * 4) =
                                 *(undefined4 *)(lVar29 + -8 + uVar14 * 4);
                            goto LAB_0017219b;
                          }
                          if (*(char *)(uVar14 + 2 + lVar33) != '\0') {
                            if (*(char *)(lVar45 + 1 + uVar14) == '\0') {
                              uVar19 = *(uint *)(lVar41 + 8 + uVar14 * 4);
                              goto LAB_00172130;
                            }
                            if (*(char *)(lVar33 + uVar14) == '\0') {
                              cVar2 = *(char *)(lVar45 + uVar14);
                              uVar19 = *(uint *)(lVar41 + 8 + uVar14 * 4);
                              goto joined_r0x00171ea1;
                            }
                            uVar19 = *(uint *)(lVar41 + 8 + uVar14 * 4);
                            goto LAB_00172145;
                          }
                          *(undefined4 *)(lVar29 + uVar14 * 4) =
                               *(undefined4 *)(lVar29 + -8 + uVar14 * 4);
                        }
LAB_0017220a:
                        uVar14 = (ulong)uVar19;
                        if (local_a8 < (int)uVar19) goto LAB_001722d7;
                        uVar14 = (ulong)(int)uVar19;
                        uVar20 = (ulong)uVar19;
                        if (*(char *)(lVar18 + uVar14) == '\0') goto LAB_0017243a;
                        lVar18 = (long)iVar22;
                        if (*(char *)(lVar33 + 3 + lVar18) == '\0') {
                          uVar19 = *(uint *)(lVar29 + lVar18 * 4);
                          goto LAB_00172583;
                        }
                        if ((*(char *)(lVar45 + uVar14) != '\0') &&
                           (*(char *)(lVar33 + lVar18) != '\0')) goto LAB_0017225c;
                        uVar19 = *(uint *)(lVar41 + uVar14 * 4);
                        uVar28 = *(uint *)(lVar29 + lVar18 * 4);
                        goto LAB_0017257e;
                      }
LAB_00171a75:
                      iVar22 = (int)uVar25;
                      uVar14 = (ulong)iVar22;
                      if (*(char *)(uVar14 + 1 + lVar18) != '\0') {
                        if (*(char *)(lVar33 + 1 + uVar14) != '\0') goto LAB_00171a8b;
                        uVar14 = (ulong)iVar22;
                        if (*(char *)(uVar14 + 2 + lVar33) != '\0') goto LAB_00171ac2;
LAB_00171acd:
                        RemSP::P_[RemSP::length_] = RemSP::length_;
                        uVar19 = RemSP::length_;
                        RemSP::length_ = RemSP::length_ + 1;
                        goto LAB_001719b9;
                      }
                    }
                    if (local_a8 < (int)uVar14) {
                      if (*(char *)(lVar18 + uVar14) == '\0') {
                        *(undefined4 *)(lVar29 + 8 + lVar39 * 4) = 0;
                        return;
                      }
LAB_0017253f:
                      if (*(char *)(lVar33 + uVar14) == '\0') {
                        if (*(char *)(lVar33 + 1 + lVar39) == '\0') {
                          RemSP::P_[RemSP::length_] = RemSP::length_;
                          uVar19 = RemSP::length_ + 1;
                          *(uint *)(lVar29 + 8 + lVar39 * 4) = RemSP::length_;
                          RemSP::length_ = uVar19;
                          return;
                        }
                        uVar8 = *(undefined4 *)(lVar41 + lVar39 * 4);
                        goto LAB_0017254b;
                      }
                    }
                    else {
                      if (*(char *)(lVar18 + uVar14) == '\0') goto LAB_00172364;
                      if (*(char *)(lVar33 + 3 + lVar39) == '\0') goto LAB_0017253f;
                      if ((*(char *)(lVar33 + uVar14) == '\0') &&
                         (*(char *)(lVar33 + 1 + lVar39) != '\0')) {
LAB_001724cb:
                        cVar2 = *(char *)(lVar45 + uVar14);
                        goto joined_r0x001724d0;
                      }
                    }
                    uVar8 = *(undefined4 *)(lVar41 + 8 + lVar39 * 4);
LAB_0017254b:
                    *(undefined4 *)(lVar29 + 8 + lVar39 * 4) = uVar8;
                    return;
                  }
                } while (*(char *)(lVar33 + 1 + uVar14) != '\0');
                goto LAB_0017177f;
              }
              if (*(char *)(lVar33 + 4 + (lVar12 >> 0x20)) == '\0') goto LAB_001717b6;
LAB_00171796:
              uVar14 = (ulong)(int)uVar25;
              if (*(char *)(lVar45 + 1 + uVar14) != '\0') {
                uVar19 = *(uint *)(lVar43 + uVar14 * 4);
                goto LAB_00172145;
              }
              uVar19 = *(uint *)(lVar41 + uVar14 * 4);
              uVar28 = *(uint *)(lVar41 + 8 + uVar14 * 4);
            } while( true );
          }
          *(undefined4 *)(lVar29 + 8 + lVar39 * 4) = *(undefined4 *)(lVar29 + lVar39 * 4);
          goto LAB_0017219b;
        }
        if (local_a8 < (int)uVar14) {
LAB_001722d7:
          uVar14 = (ulong)(int)uVar14;
          if (*(char *)(lVar18 + uVar14) == '\0') {
LAB_00172474:
            *(undefined4 *)(lVar29 + uVar14 * 4) = 0;
            return;
          }
          uVar8 = *(undefined4 *)(lVar29 + -8 + uVar14 * 4);
        }
        else {
          uVar20 = uVar14;
          if (*(char *)(lVar18 + uVar14) != '\0') {
            if (*(char *)(lVar33 + 3 + lVar39) == '\0') {
LAB_0017255c:
              uVar19 = *(uint *)(lVar29 + lVar39 * 4);
            }
            else {
              if (*(char *)(lVar45 + uVar14) != '\0') {
LAB_0017225c:
                cVar2 = *(char *)(lVar45 + -1 + uVar14);
joined_r0x001724d0:
                if (cVar2 == '\0') {
                  uVar19 = *(uint *)(lVar41 + -8 + uVar14 * 4);
                  uVar28 = *(uint *)(lVar41 + uVar14 * 4);
LAB_0017257e:
                  uVar19 = RemSP::Merge(uVar19,uVar28);
LAB_00172583:
                  *(uint *)(lVar29 + uVar14 * 4) = uVar19;
                  return;
                }
                goto LAB_0017237b;
              }
LAB_00172427:
              uVar19 = RemSP::Merge(*(uint *)(lVar41 + 8 + lVar39 * 4),
                                    *(uint *)(lVar29 + lVar39 * 4));
            }
            *(uint *)(lVar29 + 8 + lVar39 * 4) = uVar19;
            return;
          }
LAB_0017243a:
          uVar14 = (ulong)(int)uVar20;
          if (*(char *)(uVar14 + 1 + lVar18) == '\0') goto LAB_00172474;
          if (*(char *)(lVar33 + 1 + uVar14) == '\0') {
            RemSP::P_[RemSP::length_] = RemSP::length_;
            uVar19 = RemSP::length_ + 1;
            *(uint *)(lVar29 + uVar14 * 4) = RemSP::length_;
            RemSP::length_ = uVar19;
            return;
          }
LAB_001724ec:
          uVar8 = *(undefined4 *)(lVar41 + uVar14 * 4);
        }
LAB_001724f1:
        *(undefined4 *)(lVar29 + uVar14 * 4) = uVar8;
        return;
      }
      if (*(char *)(lVar33 + lVar39) == '\0') {
        RemSP::P_[RemSP::length_] = RemSP::length_;
        uVar19 = RemSP::length_ + 1;
        *(uint *)(lVar29 + lVar39 * 4) = RemSP::length_;
        RemSP::length_ = uVar19;
      }
      else {
        *(undefined4 *)(lVar29 + lVar39 * 4) = *(undefined4 *)(lVar41 + lVar39 * 4);
      }
LAB_0017219b:
      iVar22 = (int)uVar25;
      uVar19 = iVar22 + 2;
      uVar25 = (ulong)uVar19;
    } while ((int)uVar19 < local_a8);
  }
  uVar14 = (ulong)(int)uVar19;
  if (local_a8 < (int)uVar19) {
    if (*(char *)(lVar18 + uVar14) == '\0') {
LAB_00172389:
      *(undefined4 *)(lVar29 + uVar14 * 4) = 0;
      return;
    }
  }
  else {
    if (*(char *)(lVar18 + uVar14) == '\0') {
LAB_00172364:
      if (*(char *)(lVar18 + 1 + uVar14) == '\0') goto LAB_00172389;
    }
    if (*(char *)(lVar33 + 1 + uVar14) != '\0') goto LAB_0017237b;
  }
  if (*(char *)(lVar33 + uVar14) == '\0') {
    RemSP::P_[RemSP::length_] = RemSP::length_;
    uVar19 = RemSP::length_ + 1;
    *(uint *)(lVar29 + uVar14 * 4) = RemSP::length_;
    RemSP::length_ = uVar19;
    return;
  }
LAB_0017237b:
  uVar8 = *(undefined4 *)(lVar41 + uVar14 * 4);
LAB_00172380:
  *(undefined4 *)(lVar29 + uVar14 * 4) = uVar8;
  return;
code_r0x0016dd09:
  uVar25 = lVar1 + lVar43 & 0xffffffff;
  goto LAB_0016dc3c;
LAB_0016fd4e:
  *(undefined4 *)(lVar45 + lVar41 + 8 + lVar15 * 4) = *(undefined4 *)(lVar1 + lVar35);
  local_d0 = (ulong)(uint)(iVar38 + iVar13);
LAB_00170279:
  do {
    lVar31 = (long)(int)local_d0;
    local_d0 = lVar31 + 2;
    if (local_a8 <= (int)local_d0) {
      uVar14 = local_d0 & 0xffffffff;
      if (local_a8 < (int)local_d0) {
        if (*(char *)(lVar11 + uVar14) == '\0') {
LAB_00170354:
          iVar22 = (int)local_d0;
          if (*(char *)(lVar39 + uVar14) == '\0') {
            *(undefined4 *)(lVar1 + uVar14 * 4) = 0;
          }
          else {
LAB_00170361:
            lVar11 = (long)iVar22;
            if (*(char *)(lVar39 + -1 + lVar11) == '\0') {
              RemSP::P_[RemSP::length_] = RemSP::length_;
              uVar17 = RemSP::length_ + 1;
              *(uint *)(lVar1 + lVar11 * 4) = RemSP::length_;
              RemSP::length_ = uVar17;
            }
            else {
              *(undefined4 *)(lVar1 + lVar11 * 4) = *(undefined4 *)(lVar1 + -8 + lVar11 * 4);
            }
          }
          goto LAB_00171134;
        }
        if (*(char *)(lVar39 + 1 + lVar31) == '\0') {
LAB_00170347:
          uVar25 = local_d0 & 0xffffffff;
LAB_0017034a:
          uVar17 = (uint)uVar25;
          goto LAB_0016e067;
        }
LAB_001705a5:
        if (*(char *)(lVar44 + uVar14) != '\0') goto LAB_001705ac;
LAB_001705fc:
        uVar17 = *(uint *)(lVar1 + lVar31 * 4);
      }
      else {
        if (*(char *)(lVar11 + uVar14) == '\0') {
          if (*(char *)(lVar39 + uVar14) == '\0') {
LAB_00170669:
            local_d0 = local_d0 & 0xffffffff;
            goto LAB_001710c4;
          }
          if (*(char *)(lVar11 + 3 + lVar31) == '\0') {
LAB_0017065e:
            iVar22 = (int)local_d0;
            goto LAB_00170361;
          }
        }
        if (*(char *)(lVar39 + 1 + lVar31) == '\0') {
LAB_00170400:
          uVar17 = (uint)local_d0;
          goto LAB_0016dff9;
        }
        if (*(char *)(lVar44 + 3 + lVar31) == '\0') goto LAB_001705a5;
        if (*(char *)(lVar44 + lVar31) != '\0') {
LAB_001703e3:
          lVar11 = (long)(int)local_d0;
          if (*(char *)(lVar27 + -1 + lVar11) == '\0') goto LAB_001705d1;
          goto LAB_00170e43;
        }
        uVar17 = RemSP::Merge(*(uint *)(lVar24 + uVar14 * 4),*(uint *)(lVar1 + lVar31 * 4));
      }
      *(uint *)(lVar1 + uVar14 * 4) = uVar17;
      goto LAB_00171134;
    }
    if (*(char *)(lVar11 + local_d0) == '\0') {
      if (*(char *)(lVar39 + local_d0) == '\0') goto LAB_00170536;
      uVar25 = local_d0;
      if (*(char *)(lVar31 + 3 + lVar11) == '\0') goto LAB_0016eb74;
      if (*(char *)(lVar39 + 1 + lVar31) == '\0') goto LAB_0016e103;
      if (*(char *)(lVar44 + 3 + lVar31) != '\0') {
        if (*(char *)(lVar44 + lVar31) != '\0') goto LAB_001704c7;
        uVar17 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),*(uint *)(lVar1 + lVar31 * 4));
        *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
        goto LAB_0016e117;
      }
    }
    else {
      uVar25 = local_d0;
      if (*(char *)(lVar39 + 1 + lVar31) == '\0') goto LAB_0016e03a;
      if (*(char *)(lVar31 + 3 + lVar44) != '\0') {
        if (*(char *)(lVar44 + lVar31) == '\0') {
          uVar17 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),*(uint *)(lVar1 + lVar31 * 4));
          *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
        }
        else {
LAB_001702b9:
          if (*(char *)(lVar27 + -1 + local_d0) == '\0') {
            uVar17 = RemSP::Merge(*(uint *)(lVar24 + local_d0 * 4),
                                  *(uint *)(lVar1 + -8 + local_d0 * 4));
            *(uint *)(lVar1 + local_d0 * 4) = uVar17;
          }
          else {
LAB_001701c5:
            lVar31 = (long)(int)local_d0;
            if (*(char *)(lVar44 + lVar31) == '\0') {
              uVar17 = *(uint *)(lVar24 + lVar31 * 4);
              if (*(char *)(lVar27 + lVar31) == '\0') {
                uVar17 = RemSP::Merge(uVar17,*(uint *)(lVar1 + -8 + lVar31 * 4));
                *(uint *)(lVar1 + lVar31 * 4) = uVar17;
              }
              else {
                *(uint *)(lVar1 + lVar31 * 4) = uVar17;
              }
            }
            else {
              *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + lVar31 * 4);
            }
          }
        }
        goto LAB_00170be8;
      }
      if (*(char *)(lVar11 + 3 + lVar31) == '\0') {
        if (*(char *)(lVar44 + local_d0) == '\0') goto LAB_00170818;
        if (*(char *)(lVar44 + lVar31) != '\0') goto LAB_001707e6;
        uVar17 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),*(uint *)(lVar1 + lVar31 * 4));
        *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
        goto LAB_0016f24c;
      }
    }
    if (*(char *)(lVar31 + 4 + lVar44) != '\0') {
      if (*(char *)(lVar27 + 3 + lVar31) != '\0') {
        uVar25 = local_d0;
        if (*(char *)(lVar44 + lVar31) == '\0') {
          uVar17 = RemSP::Merge(*(uint *)(lVar24 + 0x10 + lVar31 * 4),*(uint *)(lVar1 + lVar31 * 4))
          ;
          *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
        }
        else {
LAB_001706ad:
          local_d0 = uVar25 & 0xffffffff;
          if (*(char *)(lVar27 + -1 + uVar25) == '\0') {
            uVar17 = RemSP::Merge(*(uint *)(lVar24 + 8 + uVar25 * 4),
                                  *(uint *)(lVar1 + -8 + uVar25 * 4));
LAB_0017056a:
            *(uint *)(lVar1 + uVar25 * 4) = uVar17;
          }
          else {
LAB_0017021c:
            if (*(char *)(lVar44 + uVar25) == '\0') {
              uVar17 = *(uint *)(lVar24 + 8 + uVar25 * 4);
              if (*(char *)(lVar27 + uVar25) == '\0') {
                uVar17 = RemSP::Merge(uVar17,*(uint *)(lVar1 + -8 + uVar25 * 4));
                *(uint *)(lVar1 + uVar25 * 4) = uVar17;
              }
              else {
                *(uint *)(lVar1 + uVar25 * 4) = uVar17;
              }
            }
            else {
              *(undefined4 *)(lVar1 + uVar25 * 4) = *(undefined4 *)(lVar24 + 8 + uVar25 * 4);
            }
          }
        }
        goto LAB_0016f5f7;
      }
      if (*(char *)(lVar44 + local_d0) == '\0') {
LAB_0017098a:
        uVar17 = RemSP::Merge(*(uint *)(lVar24 + 0x10 + lVar31 * 4),*(uint *)(lVar1 + lVar31 * 4));
        local_b0 = local_d0;
      }
      else {
        uVar25 = local_d0;
        if (*(char *)(lVar44 + lVar31) != '\0') {
LAB_00170945:
          local_d0 = uVar25 & 0xffffffff;
          if (*(char *)(lVar27 + -1 + uVar25) == '\0') {
            uVar17 = RemSP::Merge(*(uint *)(lVar24 + uVar25 * 4),*(uint *)(lVar24 + 8 + uVar25 * 4))
            ;
            uVar17 = RemSP::Merge(uVar17,*(uint *)(lVar1 + -8 + uVar25 * 4));
          }
          else {
            uVar17 = RemSP::Merge(*(uint *)(lVar24 + 8 + uVar25 * 4),
                                  *(uint *)(lVar1 + -8 + uVar25 * 4));
          }
          *(uint *)(lVar1 + uVar25 * 4) = uVar17;
          goto LAB_0016f5f7;
        }
        uVar17 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),
                              *(uint *)(lVar24 + 0x10 + lVar31 * 4));
        uVar17 = RemSP::Merge(uVar17,*(uint *)(lVar1 + lVar31 * 4));
        local_b0 = local_d0;
      }
      *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
      local_d0 = local_b0;
      goto LAB_0016f5f7;
    }
    if (*(char *)(lVar44 + 2 + lVar31) == '\0') goto LAB_0017086c;
    uVar25 = local_d0;
    if (*(char *)(lVar44 + lVar31) == '\0') {
      uVar17 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),*(uint *)(lVar1 + lVar31 * 4));
      *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
      goto LAB_0016e7b7;
    }
LAB_0017083a:
    local_d0 = uVar25 & 0xffffffff;
    uVar17 = *(uint *)(lVar24 + uVar25 * 4);
    if (*(char *)(lVar27 + -1 + uVar25) == '\0') {
      uVar17 = RemSP::Merge(uVar17,*(uint *)(lVar1 + -8 + uVar25 * 4));
      *(uint *)(lVar1 + uVar25 * 4) = uVar17;
    }
    else {
      *(uint *)(lVar1 + uVar25 * 4) = uVar17;
    }
LAB_0016e7b7:
    lVar31 = (long)(int)local_d0;
    local_d0 = lVar31 + 2;
    if (local_a8 <= (int)local_d0) {
      uVar25 = local_d0;
      if (local_a8 < (int)local_d0) goto LAB_0016fb5c;
      uVar25 = local_d0 & 0xffffffff;
      if (*(char *)(lVar11 + uVar25) == '\0') {
        if (*(char *)(lVar39 + uVar25) == '\0') goto LAB_0016fbed;
        if (*(char *)(lVar11 + 3 + lVar31) != '\0') goto LAB_0016e840;
      }
      else {
LAB_0016e840:
        if (*(char *)(lVar44 + 3 + lVar31) != '\0') {
          if (*(char *)(lVar27 + uVar25) != '\0') goto LAB_001705b7;
          uVar17 = *(uint *)(lVar24 + uVar25 * 4);
          uVar6 = *(uint *)(lVar1 + lVar31 * 4);
          goto LAB_0016fbb7;
        }
      }
LAB_0016f56f:
      uVar17 = *(uint *)(lVar1 + lVar31 * 4);
      goto LAB_00170dc5;
    }
    if (*(char *)(lVar11 + local_d0) != '\0') {
      if (*(char *)(lVar31 + 3 + lVar44) != '\0') {
        uVar25 = local_d0;
        if (*(char *)(lVar27 + local_d0) != '\0') goto LAB_0016e800;
        uVar17 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),*(uint *)(lVar1 + lVar31 * 4));
        *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
        goto LAB_00170be8;
      }
      if (*(char *)(lVar11 + 3 + lVar31) == '\0') {
        *(undefined4 *)(lVar1 + 8 + lVar31 * 4) = *(undefined4 *)(lVar1 + lVar31 * 4);
        local_d0 = local_d0 & 0xffffffff;
        goto LAB_00170279;
      }
LAB_0016e8c8:
      if (*(char *)(lVar31 + 4 + lVar44) == '\0') {
        *(undefined4 *)(lVar1 + 8 + lVar31 * 4) = *(undefined4 *)(lVar1 + lVar31 * 4);
LAB_0016f5ed:
        local_d0 = local_d0 & 0xffffffff;
        goto LAB_0016fa27;
      }
      if (*(char *)(lVar27 + 3 + lVar31) == '\0') {
        uVar17 = RemSP::Merge(*(uint *)(lVar24 + 0x10 + lVar31 * 4),*(uint *)(lVar1 + lVar31 * 4));
        *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
      }
      else {
        uVar25 = local_d0;
        if (*(char *)(lVar27 + local_d0) != '\0') goto LAB_0016fc8e;
        uVar17 = RemSP::Merge(*(uint *)(lVar24 + 0x10 + lVar31 * 4),*(uint *)(lVar1 + lVar31 * 4));
        *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
      }
      goto LAB_0016f5f7;
    }
    if (*(char *)(lVar39 + local_d0) == '\0') goto LAB_0016f4af;
    if (*(char *)(lVar31 + 3 + lVar11) == '\0') break;
    if (*(char *)(lVar44 + 3 + lVar31) == '\0') goto LAB_0016e8c8;
    uVar25 = local_d0;
    if (*(char *)(lVar27 + local_d0) == '\0') {
      uVar17 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),*(uint *)(lVar1 + lVar31 * 4));
      *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
    }
    else {
LAB_0016fe6a:
      uVar17 = *(uint *)(lVar24 + uVar25 * 4);
      if (*(char *)(lVar27 + -1 + uVar25) == '\0') {
        uVar17 = RemSP::Merge(uVar17,*(uint *)(lVar1 + -8 + uVar25 * 4));
        *(uint *)(lVar1 + uVar25 * 4) = uVar17;
      }
      else {
        *(uint *)(lVar1 + uVar25 * 4) = uVar17;
      }
    }
LAB_0016e117:
    lVar31 = (long)(int)local_d0;
    local_d0 = lVar31 + 2;
    uVar17 = (uint)local_d0;
    if (local_a8 <= (int)uVar17) {
      if (local_a8 < (int)uVar17) {
        uVar25 = local_d0 & 0xffffffff;
        goto LAB_0016fb5c;
      }
      uVar25 = local_d0 & 0xffffffff;
      if (*(char *)(lVar11 + uVar25) != '\0') goto LAB_00170e38;
      if (*(char *)(lVar39 + uVar25) == '\0') goto LAB_001710c2;
      if (*(char *)(lVar11 + 3 + lVar31) != '\0') goto LAB_00170e38;
      *(undefined4 *)(lVar1 + uVar25 * 4) = *(undefined4 *)(lVar1 + lVar31 * 4);
      goto LAB_00171134;
    }
    if (*(char *)(lVar11 + local_d0) == '\0') {
      if (*(char *)(lVar39 + local_d0) == '\0') goto LAB_0016e0ef;
      if (*(char *)(lVar11 + 3 + lVar31) == '\0') {
        *(undefined4 *)(lVar1 + 8 + lVar31 * 4) = *(undefined4 *)(lVar1 + lVar31 * 4);
LAB_0016ebb8:
        lVar31 = (long)(int)local_d0;
        local_d0 = lVar31 + 2;
        iVar22 = (int)local_d0;
        if (iVar22 < local_a8) {
          if (*(char *)(lVar11 + local_d0) == '\0') {
            uVar25 = local_d0 & 0xffffffff;
            goto LAB_0016e649;
          }
          if (*(char *)(lVar39 + 1 + lVar31) == '\0') goto LAB_0016e388;
LAB_0016ebe7:
          lVar31 = (long)(int)local_d0;
          if (*(char *)(lVar31 + 1 + lVar44) != '\0') {
            if (*(char *)(lVar44 + lVar31) == '\0') {
              if (*(char *)(lVar44 + -1 + lVar31) == '\0') {
                uVar17 = RemSP::Merge(*(uint *)(lVar24 + lVar31 * 4),
                                      *(uint *)(lVar1 + -8 + lVar31 * 4));
                *(uint *)(lVar1 + lVar31 * 4) = uVar17;
              }
              else {
                if (*(char *)(lVar27 + lVar31) == '\0') {
                  uVar17 = RemSP::Merge(*(uint *)(lVar24 + -8 + lVar31 * 4),
                                        *(uint *)(lVar24 + lVar31 * 4));
                  uVar6 = *(uint *)(lVar1 + -8 + lVar31 * 4);
                }
                else {
                  uVar17 = *(uint *)(lVar24 + lVar31 * 4);
                  uVar6 = *(uint *)(lVar1 + -8 + lVar31 * 4);
                }
                uVar17 = RemSP::Merge(uVar17,uVar6);
                *(uint *)(lVar1 + lVar31 * 4) = uVar17;
                local_d0 = local_d0 & 0xffffffff;
              }
            }
            else {
              uVar17 = RemSP::Merge(*(uint *)(lVar24 + lVar31 * 4),
                                    *(uint *)(lVar1 + -8 + lVar31 * 4));
              *(uint *)(lVar1 + lVar31 * 4) = uVar17;
            }
            goto LAB_00170be8;
          }
          if (*(char *)(lVar11 + 1 + lVar31) == '\0') {
            uVar25 = (ulong)(int)local_d0;
            if (*(char *)(lVar44 + -1 + uVar25) == '\0') goto LAB_0016f060;
            uVar17 = RemSP::Merge(*(uint *)(lVar24 + -8 + uVar25 * 4),
                                  *(uint *)(lVar1 + -8 + uVar25 * 4));
            *(uint *)(lVar1 + uVar25 * 4) = uVar17;
            goto LAB_00170279;
          }
          if (*(char *)(lVar31 + 2 + lVar44) == '\0') {
            if (*(char *)(lVar44 + -1 + lVar31) == '\0') {
LAB_0016e75c:
              if (*(char *)(lVar44 + lVar31) == '\0') {
                *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar1 + -8 + lVar31 * 4);
LAB_0016f372:
                do {
                  lVar31 = (long)(int)local_d0;
                  local_d0 = lVar31 + 2;
                  if (local_a8 <= (int)local_d0) {
                    uVar25 = local_d0;
                    if (local_a8 < (int)local_d0) goto LAB_0016fb5c;
                    uVar25 = local_d0 & 0xffffffff;
                    if (*(char *)(lVar11 + uVar25) == '\0') {
                      if (*(char *)(lVar39 + uVar25) == '\0') goto LAB_0016fbed;
                      if (*(char *)(lVar11 + 3 + lVar31) == '\0') goto LAB_0016f56f;
                    }
                    if (*(char *)(lVar44 + 3 + lVar31) == '\0') goto LAB_0016f56f;
                    uVar17 = *(uint *)(lVar24 + uVar25 * 4);
                    uVar6 = *(uint *)(lVar1 + lVar31 * 4);
                    goto LAB_0016edfe;
                  }
                  if (*(char *)(lVar11 + local_d0) != '\0') {
                    if (*(char *)(lVar31 + 3 + lVar44) != '\0') {
                      uVar17 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),
                                            *(uint *)(lVar1 + lVar31 * 4));
                      *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
                      goto LAB_00170be8;
                    }
                    if (*(char *)(lVar11 + 3 + lVar31) == '\0') {
                      *(undefined4 *)(lVar1 + 8 + lVar31 * 4) = *(undefined4 *)(lVar1 + lVar31 * 4);
                      local_d0 = local_d0 & 0xffffffff;
                      goto LAB_00170279;
                    }
LAB_0016f4f6:
                    if (*(char *)(lVar31 + 4 + lVar44) != '\0') {
                      uVar17 = RemSP::Merge(*(uint *)(lVar24 + 0x10 + lVar31 * 4),
                                            *(uint *)(lVar1 + lVar31 * 4));
                      *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
                      goto LAB_0016f5f7;
                    }
                    *(undefined4 *)(lVar1 + 8 + lVar31 * 4) = *(undefined4 *)(lVar1 + lVar31 * 4);
                    goto LAB_0016f5ed;
                  }
                  if (*(char *)(lVar39 + local_d0) != '\0') {
                    if (*(char *)(lVar31 + 3 + lVar11) == '\0') goto LAB_0016f579;
                    if (*(char *)(lVar44 + 3 + lVar31) == '\0') goto LAB_0016f4f6;
                    uVar17 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),
                                          *(uint *)(lVar1 + lVar31 * 4));
                    *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
                    goto LAB_0016e117;
                  }
LAB_0016f4af:
                  lVar31 = (long)(int)local_d0;
                  if (*(char *)(lVar31 + 1 + lVar11) == '\0') goto LAB_0016f4e3;
                  uVar25 = local_d0;
                  if (*(char *)(lVar44 + 1 + lVar31) != '\0') goto LAB_0016e10e;
                  if (*(char *)(lVar31 + 2 + lVar44) != '\0') {
                    *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + 8 + lVar31 * 4);
                    local_d0 = local_d0 & 0xffffffff;
                    goto LAB_0016f5f7;
                  }
                  RemSP::P_[RemSP::length_] = RemSP::length_;
                  uVar17 = RemSP::length_ + 1;
                  *(uint *)(lVar1 + lVar31 * 4) = RemSP::length_;
                  RemSP::length_ = uVar17;
                  local_d0 = local_d0 & 0xffffffff;
                } while( true );
              }
              uVar17 = RemSP::Merge(*(uint *)(lVar24 + lVar31 * 4),
                                    *(uint *)(lVar1 + -8 + lVar31 * 4));
              *(uint *)(lVar1 + lVar31 * 4) = uVar17;
              goto LAB_0016e7b7;
            }
            uVar17 = RemSP::Merge(*(uint *)(lVar24 + -8 + lVar31 * 4),
                                  *(uint *)(lVar1 + -8 + lVar31 * 4));
            *(uint *)(lVar1 + lVar31 * 4) = uVar17;
            goto LAB_0016fa27;
          }
          if (*(char *)(lVar44 + lVar31) == '\0') {
            if (*(char *)(lVar44 + -1 + lVar31) == '\0') {
              uVar17 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),
                                    *(uint *)(lVar1 + -8 + lVar31 * 4));
              *(uint *)(lVar1 + lVar31 * 4) = uVar17;
            }
            else if (*(char *)(lVar27 + 1 + lVar31) == '\0') {
              uVar17 = RemSP::Merge(*(uint *)(lVar24 + -8 + lVar31 * 4),
                                    *(uint *)(lVar24 + 8 + lVar31 * 4));
              uVar17 = RemSP::Merge(uVar17,*(uint *)(lVar1 + -8 + lVar31 * 4));
              *(uint *)(lVar1 + lVar31 * 4) = uVar17;
            }
            else {
              if (*(char *)(lVar27 + lVar31) == '\0') {
                uVar17 = RemSP::Merge(*(uint *)(lVar24 + -8 + lVar31 * 4),
                                      *(uint *)(lVar24 + 8 + lVar31 * 4));
                uVar6 = *(uint *)(lVar1 + -8 + lVar31 * 4);
              }
              else {
                uVar17 = *(uint *)(lVar24 + 8 + lVar31 * 4);
                uVar6 = *(uint *)(lVar1 + -8 + lVar31 * 4);
              }
              uVar17 = RemSP::Merge(uVar17,uVar6);
              *(uint *)(lVar1 + lVar31 * 4) = uVar17;
            }
          }
          else {
            if (*(char *)(lVar27 + 1 + lVar31) == '\0') {
              uVar17 = RemSP::Merge(*(uint *)(lVar24 + lVar31 * 4),
                                    *(uint *)(lVar24 + 8 + lVar31 * 4));
              uVar6 = *(uint *)(lVar1 + -8 + lVar31 * 4);
            }
            else {
              uVar17 = *(uint *)(lVar24 + 8 + lVar31 * 4);
              uVar6 = *(uint *)(lVar1 + -8 + lVar31 * 4);
            }
            uVar17 = RemSP::Merge(uVar17,uVar6);
            *(uint *)(lVar1 + lVar31 * 4) = uVar17;
          }
          goto LAB_0016f5f7;
        }
        uVar14 = local_d0 & 0xffffffff;
        if (local_a8 < iVar22) {
          if (*(char *)(lVar11 + uVar14) == '\0') {
LAB_0016ecf6:
            local_d0 = local_d0 & 0xffffffff;
            goto LAB_00170354;
          }
          if (*(char *)(lVar39 + 1 + lVar31) == '\0') {
LAB_0016ed8d:
            uVar25 = (ulong)(int)local_d0;
            if (*(char *)(lVar44 + uVar25) != '\0') goto LAB_0016e075;
            if (*(char *)(lVar44 + -1 + uVar25) == '\0') goto LAB_001710e2;
            uVar8 = *(undefined4 *)(lVar24 + -8 + uVar25 * 4);
            goto LAB_00170e97;
          }
LAB_0016ecd6:
          uVar25 = (ulong)iVar22;
          if (*(char *)(lVar44 + -1 + uVar25) == '\0') goto LAB_0016ede9;
          uVar17 = *(uint *)(lVar24 + -8 + uVar25 * 4);
        }
        else if (*(char *)(lVar11 + uVar14) == '\0') {
LAB_0016edb1:
          iVar22 = (int)local_d0;
          if (*(char *)(lVar39 + uVar14) == '\0') goto LAB_001710c4;
          uVar25 = (ulong)iVar22;
          if (*(char *)(lVar11 + 1 + uVar25) == '\0') goto LAB_00170361;
LAB_0016edce:
          uVar17 = (uint)local_d0;
          if (*(char *)(lVar39 + -1 + uVar25) == '\0') goto LAB_0016dff9;
LAB_0016ede1:
          if (*(char *)(lVar44 + 1 + uVar25) == '\0') {
LAB_0016ede9:
            if (*(char *)(lVar44 + uVar25) == '\0') {
              uVar17 = *(uint *)(lVar1 + -8 + uVar25 * 4);
              goto LAB_00170dc5;
            }
          }
          uVar17 = *(uint *)(lVar24 + uVar25 * 4);
        }
        else {
          if (*(char *)(lVar39 + 1 + lVar31) == '\0') {
LAB_0016ed66:
            uVar25 = (ulong)(int)local_d0;
            if (*(char *)(lVar44 + 1 + uVar25) == '\0') goto LAB_0016ed8d;
            if ((*(char *)(lVar44 + uVar25) != '\0') || (*(char *)(lVar44 + -1 + uVar25) == '\0'))
            goto LAB_00170dc1;
            goto LAB_00170db1;
          }
LAB_0016ecb2:
          uVar25 = (ulong)iVar22;
          if (*(char *)(lVar44 + 1 + uVar25) == '\0') goto LAB_0016ecd6;
          if ((*(char *)(lVar44 + uVar25) == '\0') && (*(char *)(lVar44 + -1 + uVar25) != '\0')) {
            if (*(char *)(lVar27 + uVar25) == '\0') {
              uVar17 = RemSP::Merge(*(uint *)(lVar24 + -8 + uVar25 * 4),
                                    *(uint *)(lVar24 + uVar25 * 4));
              uVar6 = *(uint *)(lVar1 + -8 + uVar25 * 4);
            }
            else {
              uVar17 = *(uint *)(lVar24 + uVar25 * 4);
              uVar6 = *(uint *)(lVar1 + -8 + uVar25 * 4);
            }
            uVar17 = RemSP::Merge(uVar17,uVar6);
            *(uint *)(lVar1 + uVar25 * 4) = uVar17;
            goto LAB_00171134;
          }
          uVar17 = *(uint *)(lVar24 + uVar25 * 4);
        }
        uVar6 = *(uint *)(lVar1 + -8 + uVar25 * 4);
        goto LAB_0016edfe;
      }
      uVar25 = local_d0;
      local_d0 = local_d0 & 0xffffffff;
LAB_00170f40:
      uVar14 = local_d0 & 0xffffffff;
      if (*(char *)(lVar44 + 1 + uVar25) != '\0') goto LAB_00170f58;
      goto LAB_001701f2;
    }
LAB_001701a5:
    uVar25 = (ulong)(int)local_d0;
    if (*(char *)(uVar25 + 1 + lVar44) != '\0') {
      local_d0 = local_d0 & 0xffffffff;
      goto LAB_001701c5;
    }
    uVar14 = local_d0;
    if (*(char *)(lVar11 + 1 + uVar25) != '\0') goto LAB_001701f2;
    *(undefined4 *)(lVar1 + uVar25 * 4) = *(undefined4 *)(lVar1 + -8 + uVar25 * 4);
  } while( true );
LAB_0016f579:
  *(undefined4 *)(lVar1 + 8 + lVar31 * 4) = *(undefined4 *)(lVar1 + lVar31 * 4);
  goto LAB_0016ebb8;
LAB_0016f4e3:
  local_d0 = local_d0 & 0xffffffff;
LAB_0016e23d:
  uVar17 = RemSP::length_;
  lVar31 = (long)(int)local_d0;
  if (*(char *)(lVar39 + 1 + lVar31) != '\0') {
    RemSP::P_[RemSP::length_] = RemSP::length_;
    uVar6 = RemSP::length_ + 1;
    *(uint *)(lVar1 + lVar31 * 4) = RemSP::length_;
    RemSP::length_ = uVar6;
    local_d0 = lVar31 + 2;
    iVar22 = (int)local_d0;
    if (iVar22 < local_a8) {
      if (*(char *)(lVar11 + local_d0) != '\0') goto LAB_0016ebe7;
      if (*(char *)(lVar39 + local_d0) == '\0') {
        local_d0 = local_d0 & 0xffffffff;
        goto LAB_0016e0ef;
      }
      if (*(char *)(lVar11 + 3 + lVar31) != '\0') {
        uVar25 = local_d0 & 0xffffffff;
        goto LAB_0016e669;
      }
      *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
      local_d0 = local_d0 & 0xffffffff;
      goto LAB_0016ebb8;
    }
    uVar25 = local_d0 & 0xffffffff;
    if (local_a8 < iVar22) {
      if (*(char *)(lVar11 + uVar25) != '\0') goto LAB_0016ecd6;
      uVar25 = (ulong)iVar22;
      goto LAB_0016fb65;
    }
    if (*(char *)(lVar11 + uVar25) != '\0') goto LAB_0016ecb2;
    if (*(char *)(lVar39 + uVar25) == '\0') goto LAB_001710c4;
    if (*(char *)(lVar11 + 3 + lVar31) != '\0') {
      uVar25 = (ulong)iVar22;
      goto LAB_0016ede1;
    }
    *(uint *)(lVar1 + uVar25 * 4) = uVar17;
    goto LAB_00171134;
  }
  *(undefined4 *)(lVar1 + lVar31 * 4) = 0;
  local_d0 = lVar31 + 2;
  if (local_a8 <= (int)local_d0) {
    cVar2 = *(char *)(lVar11 + (local_d0 & 0xffffffff));
    if (local_a8 < (int)local_d0) {
      if (cVar2 == '\0') goto LAB_0016e2dd;
      goto LAB_0016ed8d;
    }
    if (cVar2 == '\0') goto LAB_0016e31c;
    goto LAB_0016ed66;
  }
  if (*(char *)(lVar11 + local_d0) == '\0') {
LAB_0016e0c9:
    lVar31 = (long)(int)local_d0;
    if (*(char *)(lVar39 + lVar31) == '\0') goto LAB_0016e0ef;
    if (*(char *)(lVar11 + 1 + lVar31) == '\0') goto LAB_0016eb8e;
    uVar25 = local_d0 & 0xffffffff;
    goto LAB_0016e103;
  }
LAB_0016e388:
  iVar22 = (int)local_d0;
  lVar31 = (long)iVar22;
  if (*(char *)(lVar31 + 1 + lVar44) != '\0') {
    if ((*(char *)(lVar44 + lVar31) == '\0') && (*(char *)(lVar44 + -1 + lVar31) != '\0')) {
      local_d0 = local_d0 & 0xffffffff;
      goto LAB_00171042;
    }
    *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + lVar31 * 4);
    local_d0 = local_d0 & 0xffffffff;
    goto LAB_00170be8;
  }
  if (*(char *)(lVar11 + 1 + lVar31) != '\0') {
    lVar31 = (long)iVar22;
    if (*(char *)(lVar44 + 2 + lVar31) != '\0') {
      if (*(char *)(lVar44 + lVar31) != '\0') goto LAB_0016e3ec;
      if (*(char *)(lVar44 + -1 + lVar31) == '\0') {
        *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + 8 + lVar31 * 4);
      }
      else {
LAB_0017138a:
        if ((*(char *)(lVar27 + 1 + lVar31) == '\0') || (*(char *)(lVar27 + lVar31) == '\0')) {
          uVar17 = RemSP::Merge(*(uint *)(lVar24 + -8 + lVar31 * 4),
                                *(uint *)(lVar24 + 8 + lVar31 * 4));
          *(uint *)(lVar1 + lVar31 * 4) = uVar17;
        }
        else {
          *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + 8 + lVar31 * 4);
        }
      }
      goto LAB_0016f5f7;
    }
    if (*(char *)(lVar44 + lVar31) != '\0') {
      *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + lVar31 * 4);
      goto LAB_0016e7b7;
    }
    if (*(char *)(lVar44 + -1 + lVar31) == '\0') {
      RemSP::P_[RemSP::length_] = RemSP::length_;
      uVar17 = RemSP::length_ + 1;
      *(uint *)(lVar1 + lVar31 * 4) = RemSP::length_;
      RemSP::length_ = uVar17;
    }
    else {
      *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + -8 + lVar31 * 4);
    }
    goto LAB_0016f372;
  }
  lVar31 = (long)iVar22;
  if (*(char *)(lVar44 + lVar31) == '\0') {
    if (*(char *)(lVar44 + -1 + lVar31) == '\0') {
      RemSP::P_[RemSP::length_] = RemSP::length_;
      uVar17 = RemSP::length_ + 1;
      *(uint *)(lVar1 + lVar31 * 4) = RemSP::length_;
      RemSP::length_ = uVar17;
    }
    else {
      *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + -8 + lVar31 * 4);
    }
    local_d0 = local_d0 & 0xffffffff;
    goto LAB_0016e55b;
  }
  *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + lVar31 * 4);
  local_d0 = local_d0 & 0xffffffff;
LAB_0016f24c:
  while( true ) {
    lVar31 = (long)(int)local_d0;
    local_d0 = lVar31 + 2;
    if (local_a8 <= (int)local_d0) {
      uVar14 = local_d0 & 0xffffffff;
      if (local_a8 < (int)local_d0) {
        if (*(char *)(lVar11 + uVar14) == '\0') goto LAB_00170354;
        if (*(char *)(lVar39 + 1 + lVar31) == '\0') goto LAB_00170347;
      }
      else {
        if (*(char *)(lVar11 + uVar14) == '\0') {
          if (*(char *)(lVar39 + uVar14) == '\0') goto LAB_00170669;
          if (*(char *)(lVar11 + 3 + lVar31) == '\0') goto LAB_0017065e;
        }
        if (*(char *)(lVar39 + 1 + lVar31) == '\0') goto LAB_00170400;
        if (*(char *)(lVar44 + 3 + lVar31) != '\0') goto LAB_001703e3;
      }
      if (*(char *)(lVar44 + uVar14) != '\0') goto LAB_001705b7;
      goto LAB_001705fc;
    }
    if (*(char *)(lVar11 + local_d0) == '\0') break;
    uVar25 = local_d0;
    if (*(char *)(lVar39 + 1 + lVar31) == '\0') goto LAB_0016e03a;
    if (*(char *)(lVar31 + 3 + lVar44) != '\0') goto LAB_001702b9;
    if (*(char *)(lVar11 + 3 + lVar31) != '\0') goto LAB_0016f325;
    if (*(char *)(lVar44 + local_d0) == '\0') {
LAB_00170818:
      *(undefined4 *)(lVar1 + 8 + lVar31 * 4) = *(undefined4 *)(lVar1 + lVar31 * 4);
LAB_0016e55b:
      while( true ) {
        lVar31 = (long)(int)local_d0;
        uVar25 = lVar31 + 2;
        iVar22 = (int)uVar25;
        local_d0 = uVar25;
        if (local_a8 <= iVar22) {
          uVar14 = uVar25 & 0xffffffff;
          if (iVar22 <= local_a8) {
            if (*(char *)(lVar11 + uVar14) == '\0') goto LAB_0016edb1;
            uVar25 = (ulong)iVar22;
            goto LAB_0016edce;
          }
          if (*(char *)(lVar11 + uVar14) == '\0') goto LAB_0016ecf6;
          if (*(char *)(lVar39 + 1 + lVar31) == '\0') goto LAB_0017034a;
          uVar25 = (ulong)iVar22;
          goto LAB_0016ede9;
        }
        if (*(char *)(lVar11 + uVar25) == '\0') goto LAB_0016e649;
        if (*(char *)(lVar39 + 1 + lVar31) == '\0') {
          uVar25 = uVar25 & 0xffffffff;
          goto LAB_0016e03a;
        }
        if (*(char *)(lVar31 + 3 + lVar44) != '\0') {
          uVar17 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),*(uint *)(lVar1 + lVar31 * 4));
          *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
          local_d0 = uVar25 & 0xffffffff;
          goto LAB_00170be8;
        }
        if (*(char *)(lVar11 + 3 + lVar31) != '\0') goto LAB_0016e6e5;
LAB_0016f060:
        local_d0 = local_d0 & 0xffffffff;
        if (*(char *)(lVar44 + uVar25) != '\0') break;
        *(undefined4 *)(lVar1 + uVar25 * 4) = *(undefined4 *)(lVar1 + -8 + uVar25 * 4);
      }
      uVar17 = RemSP::Merge(*(uint *)(lVar24 + uVar25 * 4),*(uint *)(lVar1 + -8 + uVar25 * 4));
      *(uint *)(lVar1 + uVar25 * 4) = uVar17;
    }
    else {
LAB_001707e6:
      uVar17 = *(uint *)(lVar24 + local_d0 * 4);
      if (*(char *)(lVar27 + -1 + local_d0) == '\0') {
        uVar17 = RemSP::Merge(uVar17,*(uint *)(lVar1 + -8 + local_d0 * 4));
        *(uint *)(lVar1 + local_d0 * 4) = uVar17;
      }
      else {
        *(uint *)(lVar1 + local_d0 * 4) = uVar17;
      }
    }
  }
  if (*(char *)(lVar39 + local_d0) == '\0') goto LAB_00170536;
  uVar25 = local_d0;
  if (*(char *)(lVar31 + 3 + lVar11) == '\0') goto LAB_0016eb74;
  if (*(char *)(lVar39 + 1 + lVar31) == '\0') goto LAB_0016e103;
  if (*(char *)(lVar44 + 3 + lVar31) != '\0') goto LAB_001704c7;
LAB_0016f325:
  if (*(char *)(lVar31 + 4 + lVar44) != '\0') {
    uVar25 = local_d0;
    if (*(char *)(lVar27 + 3 + lVar31) != '\0') goto LAB_001706ad;
    if (*(char *)(lVar44 + local_d0) != '\0') goto LAB_00170945;
    goto LAB_0017098a;
  }
  uVar25 = local_d0;
  if (*(char *)(lVar44 + local_d0) != '\0') goto LAB_0017083a;
LAB_0017086c:
  *(undefined4 *)(lVar1 + 8 + lVar31 * 4) = *(undefined4 *)(lVar1 + lVar31 * 4);
  local_d0 = local_d0 & 0xffffffff;
  goto LAB_0016f372;
LAB_00170536:
  local_d0 = local_d0 & 0xffffffff;
  goto LAB_0016e0ef;
LAB_001704c7:
  if (*(char *)(lVar27 + -1 + local_d0) == '\0') {
    uVar17 = RemSP::Merge(*(uint *)(lVar24 + local_d0 * 4),*(uint *)(lVar1 + -8 + local_d0 * 4));
    *(uint *)(lVar1 + local_d0 * 4) = uVar17;
  }
  else {
LAB_00170f58:
    lVar31 = (long)(int)local_d0;
    if (*(char *)(lVar44 + lVar31) == '\0') {
      uVar17 = *(uint *)(lVar24 + lVar31 * 4);
      if (*(char *)(lVar27 + lVar31) == '\0') {
        uVar17 = RemSP::Merge(uVar17,*(uint *)(lVar1 + -8 + lVar31 * 4));
        *(uint *)(lVar1 + lVar31 * 4) = uVar17;
      }
      else {
        *(uint *)(lVar1 + lVar31 * 4) = uVar17;
      }
    }
    else {
      *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + lVar31 * 4);
    }
  }
  goto LAB_0016e117;
LAB_0016e649:
  local_d0 = (ulong)(int)uVar25;
  if (*(char *)(lVar39 + local_d0) != '\0') {
    if (*(char *)(lVar11 + 1 + local_d0) == '\0') goto LAB_0016eb74;
    if (*(char *)(lVar39 + -1 + local_d0) != '\0') {
LAB_0016e669:
      if (*(char *)(lVar44 + 1 + local_d0) != '\0') {
        uVar17 = RemSP::Merge(*(uint *)(lVar24 + local_d0 * 4),*(uint *)(lVar1 + -8 + local_d0 * 4))
        ;
        *(uint *)(lVar1 + local_d0 * 4) = uVar17;
        local_d0 = uVar25;
        goto LAB_0016e117;
      }
LAB_0016e6e5:
      lVar31 = (long)(int)uVar25;
      if (*(char *)(lVar31 + 2 + lVar44) == '\0') {
        local_d0 = uVar25 & 0xffffffff;
        goto LAB_0016e75c;
      }
      if (*(char *)(lVar27 + 1 + lVar31) == '\0') {
        if (*(char *)(lVar44 + lVar31) == '\0') {
          uVar6 = *(uint *)(lVar24 + 8 + lVar31 * 4);
          uVar17 = *(uint *)(lVar1 + -8 + lVar31 * 4);
        }
        else {
          uVar6 = RemSP::Merge(*(uint *)(lVar24 + lVar31 * 4),*(uint *)(lVar24 + 8 + lVar31 * 4));
          uVar17 = *(uint *)(lVar1 + -8 + lVar31 * 4);
        }
        uVar17 = RemSP::Merge(uVar6,uVar17);
        *(uint *)(lVar1 + lVar31 * 4) = uVar17;
        local_d0 = uVar25 & 0xffffffff;
      }
      else {
        uVar17 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),*(uint *)(lVar1 + -8 + lVar31 * 4))
        ;
        *(uint *)(lVar1 + lVar31 * 4) = uVar17;
        local_d0 = uVar25 & 0xffffffff;
      }
      goto LAB_0016f5f7;
    }
    goto LAB_0016e103;
  }
  local_d0 = uVar25 & 0xffffffff;
LAB_0016e0ef:
  uVar25 = local_d0 & 0xffffffff;
  if (*(char *)(lVar11 + 1 + (long)(int)local_d0) != '\0') goto LAB_0016e103;
  goto LAB_0016e23d;
LAB_0016eb74:
  local_d0 = uVar25 & 0xffffffff;
  lVar31 = (long)(int)uVar25;
  if (*(char *)(lVar39 + -1 + lVar31) == '\0') {
LAB_0016eb8e:
    RemSP::P_[RemSP::length_] = RemSP::length_;
    uVar17 = RemSP::length_ + 1;
    *(uint *)(lVar1 + lVar31 * 4) = RemSP::length_;
    RemSP::length_ = uVar17;
  }
  else {
    *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar1 + -8 + lVar31 * 4);
  }
  goto LAB_0016ebb8;
LAB_0016e103:
  lVar31 = (long)(int)uVar25;
  local_d0 = uVar25;
  if (*(char *)(lVar44 + 1 + lVar31) != '\0') {
LAB_0016e10e:
    *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + lVar31 * 4);
    local_d0 = uVar25;
    goto LAB_0016e117;
  }
LAB_0016e16f:
  lVar31 = (long)(int)local_d0;
  if (*(char *)(lVar44 + 2 + lVar31) != '\0') {
    if (*(char *)(lVar44 + lVar31) != '\0') goto LAB_0016e3ec;
    *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + 8 + lVar31 * 4);
    goto LAB_0016f5f7;
  }
  if (*(char *)(lVar44 + lVar31) != '\0') {
    *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + lVar31 * 4);
    goto LAB_0016e7b7;
  }
  RemSP::P_[RemSP::length_] = RemSP::length_;
  uVar17 = RemSP::length_ + 1;
  *(uint *)(lVar1 + lVar31 * 4) = RemSP::length_;
  RemSP::length_ = uVar17;
  goto LAB_0016f372;
LAB_001701f2:
  local_d0 = uVar14;
  if (*(char *)(lVar44 + 2 + uVar25) != '\0') {
LAB_00170206:
    if (*(char *)(lVar27 + 1 + uVar25) != '\0') goto LAB_0017021c;
    uVar17 = RemSP::Merge(*(uint *)(lVar24 + 8 + uVar25 * 4),*(uint *)(lVar1 + -8 + uVar25 * 4));
    goto LAB_0017056a;
  }
  *(undefined4 *)(lVar1 + uVar25 * 4) = *(undefined4 *)(lVar1 + -8 + uVar25 * 4);
  goto LAB_0016fa27;
LAB_00170ff9:
  local_d0 = (ulong)(uint)(iVar13 + (int)lVar15);
  lVar31 = lVar36 + 0x200000000 >> 0x20;
LAB_00171042:
  if (*(char *)(lVar27 + lVar31) == '\0') {
    uVar17 = RemSP::Merge(*(uint *)(lVar24 + -8 + lVar31 * 4),*(uint *)(lVar24 + lVar31 * 4));
    *(uint *)(lVar1 + lVar31 * 4) = uVar17;
  }
  else {
    *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + lVar31 * 4);
  }
  goto LAB_00170be8;
code_r0x00171b79:
  if (*(char *)(lVar1 + lVar34) == '\0') {
    uVar25 = (ulong)(uint)(iVar13 + iVar38);
    *(undefined4 *)(lVar39 + lVar34 * 4) = *(undefined4 *)(lVar29 + (lVar12 >> 0x1e));
    goto LAB_00171cf3;
  }
  uVar19 = *(uint *)(lVar10 + lVar34 * 4);
  if (*(char *)(lVar16 + lVar42 + lVar34) == '\0') {
    uVar19 = RemSP::Merge(uVar19,*(uint *)(lVar39 + -8 + lVar34 * 4));
  }
  *(uint *)(lVar39 + lVar34 * 4) = uVar19;
  lVar12 = lVar12 + 0x200000000;
  lVar15 = lVar42 + lVar34;
  lVar34 = lVar34 + 2;
  if ((long)uVar20 <= lVar15 + 4) {
    uVar19 = iVar22 + (int)lVar34 + 2;
    iVar22 = iVar22 + (int)lVar34;
    goto LAB_001722ce;
  }
  goto LAB_00171b56;
code_r0x00171fc1:
  *(undefined4 *)(lVar42 + lVar12 * 4) = *(undefined4 *)(lVar1 + -8 + lVar12 * 4);
  lVar9 = lVar39 + lVar12;
  lVar12 = lVar12 + 2;
  if ((long)uVar20 <= lVar9 + 2) {
    iVar13 = iVar22 + (int)lVar12 + 2;
    iVar22 = iVar22 + (int)lVar12;
    goto LAB_0017227c;
  }
  goto LAB_00171f9c;
LAB_00171ac2:
  *(undefined4 *)(lVar29 + uVar14 * 4) = *(undefined4 *)(lVar41 + 8 + uVar14 * 4);
  uVar14 = uVar25;
  goto LAB_00171aed;
LAB_0016db0f:
  uVar8 = 0;
LAB_0016db24:
  *(undefined4 *)(lVar29 + lVar23 * 4) = uVar8;
LAB_0016db28:
  uVar19 = uVar28 + 2;
  uVar20 = (ulong)uVar19;
  if ((int)uVar17 <= (int)uVar19) goto LAB_0016db37;
  goto LAB_0016da79;
}

Assistant:

void FirstScan()
	{
		const int h = img_.rows;
		const int w = img_.cols;

		e_rows = h & 0xfffffffe;
		o_rows = h % 2 == 1;
		e_cols = w & 0xfffffffe;
		o_cols = w % 2 == 1;

		LabelsSolver::Setup(); // Labels solver initialization

							   // We work with 2x2 blocks
							   // +-+-+-+
							   // |P|Q|R|
							   // +-+-+-+
							   // |S|X|
							   // +-+-+

							   // The pixels are named as follows
							   // +---+---+---+
							   // |a b|c d|e f|
							   // |g h|i j|k l|
							   // +---+---+---+
							   // |m n|o p|
							   // |q r|s t|
							   // +---+---+

							   // Pixels a, f, l, q are not needed, since we need to understand the
							   // the connectivity between these blocks and those pixels only matter
							   // when considering the outer connectivities

							   // A bunch of defines used to check if the pixels are foreground,
							   // without going outside the image limits.

							   // First scan

		// Define Conditions and Actions
		{
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

			// Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
							   // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
							   //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
							   // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
							   // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
							   // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
							   // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
							   //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
							   // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
							   // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
							   // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
							   // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
							   // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
							   // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
							   //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
							   //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
		}

		if (h == 1) {
			// Single line
			// int r = 0;
			const unsigned char* const img_row = img_.ptr<unsigned char>(0);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				// int r = 0;
				const unsigned char* const img_row = img_.ptr<unsigned char>(0);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
				int c = -2;

#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < e_rows; r += 2) {
				// Get rows pointer
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

				int c = -2;
				goto tree_0;

#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case the rows are odd)
			if (o_rows)
			{
				int r = h - 1;
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}


		// Undef Conditions and Actions
		{
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
		}
	}